

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackNSISGenerator.cxx
# Opt level: O3

int __thiscall cmCPackNSISGenerator::PackageFiles(cmCPackNSISGenerator *this)

{
  _Rb_tree_header *p_Var1;
  char *pcVar2;
  pointer pcVar3;
  cmCPackLog *pcVar4;
  cmCPackInstallationType *pcVar5;
  byte bVar6;
  optional<std::basic_string_view<char,_std::char_traits<char>_>_> alt;
  optional<std::basic_string_view<char,_std::char_traits<char>_>_> alt_00;
  cmCPackGenerator *pcVar7;
  bool bVar8;
  bool bVar9;
  int iVar10;
  string *psVar11;
  ulong uVar12;
  ostream *poVar13;
  size_t sVar14;
  long lVar15;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar16;
  mapped_type *pmVar17;
  string *psVar18;
  const_iterator cVar19;
  cmValue cVar20;
  _Rb_tree_node_base *p_Var21;
  long *plVar22;
  undefined8 *puVar23;
  _Base_ptr p_Var24;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar25;
  ulong *puVar26;
  size_type *psVar27;
  ulong uVar28;
  char *extraout_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar29;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *arg;
  _Alloc_hider _Var30;
  undefined8 uVar31;
  undefined8 uVar32;
  undefined1 auVar33 [8];
  pointer ppcVar34;
  byte bVar35;
  cmCPackNSISGenerator *pcVar36;
  pointer pbVar37;
  pointer pbVar38;
  string_view name;
  string_view name_00;
  string_view componentName;
  string_view componentName_00;
  string_view componentName_01;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_00;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_01;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_02;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_03;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_04;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_05;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_06;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_07;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_08;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_09;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  init;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_10;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_11;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  init_00;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_12;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_13;
  string_view value;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_14;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_15;
  basic_string_view<char,_std::char_traits<char>_> __str;
  basic_string_view<char,_std::char_traits<char>_> __str_00;
  string output;
  string nsisFileName;
  string nsisInstallOptions;
  string installerHeaderImage;
  string nsisPreArguments;
  string nsisPostArguments;
  string nsisCmd;
  ostringstream cmCPackLog_msg;
  string componentDescriptions;
  string fileN_1;
  int retVal;
  vector<cmCPackInstallationType_*,_std::allocator<cmCPackInstallationType_*>_> installTypes;
  string defines;
  string installTypesCode;
  string tmpFile;
  string nsisInFileName;
  string nsisInInstallOptions;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  dirs;
  ostringstream dstr;
  ostringstream str;
  string local_a28;
  cmCPackNSISGenerator *local_a08;
  string local_a00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_9c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_9c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_9b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_9a8;
  long local_998 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_988;
  string local_968;
  string local_948;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_928;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_918;
  string local_908;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_8e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_8d8;
  undefined1 local_8c8 [8];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_8c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_8b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_8a8;
  undefined8 local_8a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_898;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_888;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_880;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_878;
  undefined8 local_858;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_850;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_848;
  undefined8 local_840;
  undefined8 local_838;
  undefined1 *local_830;
  undefined8 local_828;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_660;
  _Rb_tree_node_base *local_640;
  string local_638;
  undefined1 local_618 [16];
  undefined1 local_608 [96];
  ios_base local_5a8 [264];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4a0;
  undefined1 *local_480;
  long local_478;
  undefined1 local_470;
  undefined7 uStack_46f;
  vector<cmCPackInstallationType_*,_std::allocator<cmCPackInstallationType_*>_> local_460;
  undefined1 *local_448;
  undefined8 local_440;
  undefined1 local_438;
  undefined7 uStack_437;
  string local_428;
  string local_408;
  undefined1 *local_3e8;
  undefined8 local_3e0;
  undefined1 local_3d8;
  undefined7 uStack_3d7;
  string local_3c8;
  string local_3a8;
  string local_388;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_368;
  undefined8 local_350;
  undefined8 uStack_348;
  undefined1 local_340;
  uint7 uStack_33f;
  undefined8 local_338;
  undefined8 uStack_330;
  undefined1 local_328;
  uint7 uStack_327;
  undefined1 local_320 [112];
  ios_base local_2b0 [264];
  undefined1 local_1a8 [16];
  _func_int *local_198 [12];
  ios_base local_138 [264];
  
  local_328 = 0;
  alt.super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>.
  _M_payload.super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
  _M_payload._M_value._M_str = (char *)uStack_330;
  alt.super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>.
  _M_payload.super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
  _M_payload._M_value._M_len = local_338;
  alt.super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>.
  _M_payload.super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
  _16_8_ = (ulong)uStack_327 << 8;
  name._M_str = "NSIS.template.in";
  name._M_len = 0x10;
  cmCPackGenerator::FindTemplate_abi_cxx11_(&local_3a8,&this->super_cmCPackGenerator,name,alt);
  if (local_3a8._M_string_length == 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_8c8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_8c8,"CPack error: Could not find NSIS installer template file.",0x39
              );
    std::ios::widen((char)(ostream *)local_8c8 + (char)*(long *)((long)local_8c8 + -0x18));
    std::ostream::put((char)local_8c8);
    std::ostream::flush();
    pcVar4 = (this->super_cmCPackGenerator).Logger;
    std::__cxx11::stringbuf::str();
    uVar32 = local_1a8._0_8_;
    sVar14 = strlen((char *)local_1a8._0_8_);
    cmCPackLog::Log(pcVar4,0x10,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CPack/cmCPackNSISGenerator.cxx"
                    ,0x31,(char *)uVar32,sVar14);
    if ((_func_int **)local_1a8._0_8_ != local_198) {
      operator_delete((void *)local_1a8._0_8_,(ulong)(local_198[0] + 1));
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_8c8);
    std::ios_base::~ios_base((ios_base *)&local_858);
    iVar10 = 0;
    goto LAB_001bd61d;
  }
  local_340 = 0;
  alt_00.super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>.
  _M_payload.super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
  _M_payload._M_value._M_str = (char *)uStack_348;
  alt_00.super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>.
  _M_payload.super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
  _M_payload._M_value._M_len = local_350;
  alt_00.super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>.
  _M_payload.super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
  _16_8_ = (ulong)uStack_33f << 8;
  name_00._M_str = "NSIS.InstallOptions.ini.in";
  name_00._M_len = 0x1a;
  cmCPackGenerator::FindTemplate_abi_cxx11_(&local_388,&this->super_cmCPackGenerator,name_00,alt_00)
  ;
  if (local_388._M_string_length == 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_8c8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_8c8,"CPack error: Could not find NSIS installer options file.",0x38)
    ;
    std::ios::widen((char)(ostream *)local_8c8 + (char)*(long *)((long)local_8c8 + -0x18));
    std::ostream::put((char)local_8c8);
    std::ostream::flush();
    pcVar4 = (this->super_cmCPackGenerator).Logger;
    std::__cxx11::stringbuf::str();
    uVar32 = local_1a8._0_8_;
    sVar14 = strlen((char *)local_1a8._0_8_);
    cmCPackLog::Log(pcVar4,0x10,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CPack/cmCPackNSISGenerator.cxx"
                    ,0x39,(char *)uVar32,sVar14);
    if ((_func_int **)local_1a8._0_8_ != local_198) {
      operator_delete((void *)local_1a8._0_8_,(ulong)(local_198[0] + 1));
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_8c8);
    std::ios_base::~ios_base((ios_base *)&local_858);
    iVar10 = 0;
  }
  else {
    local_8c8 = (undefined1  [8])&local_8b8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_8c8,"CPACK_TOPLEVEL_DIRECTORY","");
    psVar11 = (string *)
              cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,(string *)local_8c8);
    if (psVar11 == (string *)0x0) {
      psVar11 = &cmValue::Empty_abi_cxx11_;
    }
    local_9c8 = &local_9b8;
    pcVar3 = (psVar11->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_9c8,pcVar3,pcVar3 + psVar11->_M_string_length);
    if (local_8c8 != (undefined1  [8])&local_8b8) {
      operator_delete((void *)local_8c8,(ulong)(local_8b8._M_allocated_capacity + 1));
    }
    local_8c8 = (undefined1  [8])local_9c0;
    local_8c0 = local_9c8;
    local_8b8._M_allocated_capacity = 0;
    local_8b8._8_8_ = 0xf;
    local_8a8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0x807975;
    local_8a0 = 0;
    views._M_len = 2;
    views._M_array = (iterator)local_8c8;
    cmCatViews(&local_3c8,views);
    local_9a8._M_allocated_capacity = (size_type)local_998;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_9a8,local_9c8,local_9c0->_M_local_buf + (long)local_9c8);
    std::__cxx11::string::append(local_9a8._M_local_buf);
    std::__cxx11::string::append((char *)&local_9c8);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    pbVar37 = (this->super_cmCPackGenerator).files.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pbVar38 = (this->super_cmCPackGenerator).files.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    local_a08 = this;
    if (pbVar37 != pbVar38) {
      local_640 = (_Rb_tree_node_base *)&(this->super_cmCPackGenerator).toplevel;
      do {
        local_8c8 = (undefined1  [8])&local_8b8;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_8c8,"$INSTDIR","");
        cmSystemTools::RelativePath((string *)local_320,(string *)local_640,pbVar37);
        if ((local_a08->super_cmCPackGenerator).Components._M_t._M_impl.super__Rb_tree_header.
            _M_node_count != 0) {
          uVar12 = std::__cxx11::string::find((char)(string *)local_320,0x2f);
          if (uVar12 == 0xffffffffffffffff) {
            componentName_00._M_str = (char *)local_320._0_8_;
            componentName_00._M_len = local_320._8_8_;
            CustomComponentInstallDirectory_abi_cxx11_
                      ((string *)local_618,local_a08,componentName_00);
          }
          else {
            uVar28 = local_320._8_8_;
            if (uVar12 <= (ulong)local_320._8_8_) {
              uVar28 = uVar12;
            }
            componentName._M_str = (char *)local_320._0_8_;
            componentName._M_len = uVar28;
            CustomComponentInstallDirectory_abi_cxx11_((string *)local_618,local_a08,componentName);
          }
          std::__cxx11::string::operator=((string *)local_8c8,(string *)local_618);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_618._0_8_ !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_608) {
            operator_delete((void *)local_618._0_8_,(ulong)(local_608._0_8_ + 1));
          }
          std::__cxx11::string::substr((ulong)local_618,(ulong)local_320);
          std::__cxx11::string::operator=((string *)local_320,(string *)local_618);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_618._0_8_ !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_608) {
            operator_delete((void *)local_618._0_8_,(ulong)(local_608._0_8_ + 1));
          }
        }
        if (local_320._8_8_ != 0) {
          uVar12 = 0;
          do {
            if (*(char *)(local_320._0_8_ + uVar12) == '/') {
              *(char *)(local_320._0_8_ + uVar12) = '\\';
            }
            uVar12 = uVar12 + 1;
          } while (local_320._8_8_ != uVar12);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"  Delete \"",10);
        poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1a8,(char *)local_8c8,(long)local_8c0);
        std::__ostream_insert<char,std::char_traits<char>>(poVar13,"\\",1);
        poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                            (poVar13,(char *)local_320._0_8_,local_320._8_8_);
        std::__ostream_insert<char,std::char_traits<char>>(poVar13,"\"",1);
        std::ios::widen((char)poVar13->_vptr_basic_ostream[-3] + (char)poVar13);
        std::ostream::put((char)poVar13);
        std::ostream::flush();
        if ((undefined1 *)local_320._0_8_ != local_320 + 0x10) {
          operator_delete((void *)local_320._0_8_,local_320._16_8_ + 1);
        }
        if (local_8c8 != (undefined1  [8])&local_8b8) {
          operator_delete((void *)local_8c8,(ulong)(local_8b8._M_allocated_capacity + 1));
        }
        pbVar37 = pbVar37 + 1;
      } while (pbVar37 != pbVar38);
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_8c8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_8c8,"Uninstall Files: ",0x11);
    pcVar36 = local_a08;
    std::__cxx11::stringbuf::str();
    poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_8c8,(char *)local_320._0_8_,local_320._8_8_);
    std::ios::widen((char)poVar13->_vptr_basic_ostream[-3] + (char)poVar13);
    std::ostream::put((char)poVar13);
    std::ostream::flush();
    pcVar2 = local_320 + 0x10;
    if ((char *)local_320._0_8_ != pcVar2) {
      operator_delete((void *)local_320._0_8_,local_320._16_8_ + 1);
    }
    pcVar4 = (pcVar36->super_cmCPackGenerator).Logger;
    std::__cxx11::stringbuf::str();
    uVar32 = local_320._0_8_;
    sVar14 = strlen((char *)local_320._0_8_);
    cmCPackLog::Log(pcVar4,4,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CPack/cmCPackNSISGenerator.cxx"
                    ,0x58,(char *)uVar32,sVar14);
    if ((char *)local_320._0_8_ != pcVar2) {
      operator_delete((void *)local_320._0_8_,local_320._16_8_ + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_8c8);
    std::ios_base::~ios_base((ios_base *)&local_858);
    local_8c8 = (undefined1  [8])&local_8b8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_8c8,"CPACK_NSIS_DELETE_FILES","");
    std::__cxx11::stringbuf::str();
    cmCPackGenerator::SetOptionIfNotSet
              (&pcVar36->super_cmCPackGenerator,(string *)local_8c8,(string *)local_320);
    if ((char *)local_320._0_8_ != pcVar2) {
      operator_delete((void *)local_320._0_8_,local_320._16_8_ + 1);
    }
    if (local_8c8 != (undefined1  [8])&local_8b8) {
      operator_delete((void *)local_8c8,(ulong)(local_8b8._M_allocated_capacity + 1));
    }
    local_368.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (string *)0x0;
    local_368.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (string *)0x0;
    local_368.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    GetListOfSubdirectories
              (pcVar36,(pcVar36->super_cmCPackGenerator).toplevel._M_dataplus._M_p,&local_368);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_320);
    pbVar37 = local_368.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    if (local_368.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_368.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      pcVar7 = &local_a08->super_cmCPackGenerator;
      local_640 = (_Rb_tree_node_base *)&(local_a08->super_cmCPackGenerator).Components;
      pbVar38 = local_368.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      do {
        local_8c8 = (undefined1  [8])&local_8b8;
        local_8c0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)0x0;
        local_8b8._M_allocated_capacity = local_8b8._M_allocated_capacity & 0xffffffffffffff00;
        cmSystemTools::RelativePath((string *)local_618,&pcVar7->toplevel,pbVar38);
        if (local_618._8_8_ != 0) {
          if ((local_a08->super_cmCPackGenerator).Components._M_t._M_impl.super__Rb_tree_header.
              _M_node_count == 0) {
            paVar16 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(local_618._0_8_ + local_618._8_8_);
            paVar25 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_618._0_8_;
LAB_001b986d:
            do {
              if (paVar25->_M_local_buf[0] == '/') {
                paVar25->_M_local_buf[0] = '\\';
              }
              paVar25 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)(paVar25->_M_local_buf + 1);
            } while (paVar25 != paVar16);
          }
          else {
            lVar15 = std::__cxx11::string::find((char)(string *)local_618,0x2f);
            if (lVar15 != -1) {
              std::__cxx11::string::substr((ulong)&local_a00,(ulong)local_618);
              std::__cxx11::string::operator=((string *)local_8c8,(string *)&local_a00);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_a00._M_dataplus._M_p != &local_a00.field_2) {
                operator_delete(local_a00._M_dataplus._M_p,
                                local_a00.field_2._M_allocated_capacity + 1);
              }
              std::__cxx11::string::erase((ulong)local_618,0);
            }
            if (local_618._8_8_ != 0) {
              paVar16 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)(local_618._0_8_ + local_618._8_8_);
              paVar25 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_618._0_8_;
              goto LAB_001b986d;
            }
          }
          componentName_01._M_str = (char *)local_8c8;
          componentName_01._M_len = (size_t)local_8c0;
          CustomComponentInstallDirectory_abi_cxx11_(&local_a00,local_a08,componentName_01);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,"  RMDir \"",9);
          poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_320,local_a00._M_dataplus._M_p,
                               local_a00._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar13,"\\",1);
          poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                              (poVar13,(char *)local_618._0_8_,local_618._8_8_);
          std::__ostream_insert<char,std::char_traits<char>>(poVar13,"\"",1);
          std::ios::widen((char)poVar13->_vptr_basic_ostream[-3] + (char)poVar13);
          std::ostream::put((char)poVar13);
          std::ostream::flush();
          if (local_8c0 !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0) {
            pmVar17 = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent>_>_>
                      ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent>_>_>
                                    *)local_640,(key_type *)local_8c8);
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       &pmVar17->Directories,(string *)local_618);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a00._M_dataplus._M_p != &local_a00.field_2) {
            operator_delete(local_a00._M_dataplus._M_p,local_a00.field_2._M_allocated_capacity + 1);
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_618._0_8_ !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_608) {
          operator_delete((void *)local_618._0_8_,(ulong)(local_608._0_8_ + 1));
        }
        if (local_8c8 != (undefined1  [8])&local_8b8) {
          operator_delete((void *)local_8c8,(ulong)(local_8b8._M_allocated_capacity + 1));
        }
        pbVar38 = pbVar38 + 1;
      } while (pbVar38 != pbVar37);
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_8c8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_8c8,"Uninstall Dirs: ",0x10)
    ;
    pcVar36 = local_a08;
    std::__cxx11::stringbuf::str();
    poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_8c8,(char *)local_618._0_8_,local_618._8_8_);
    std::ios::widen((char)poVar13->_vptr_basic_ostream[-3] + (char)poVar13);
    std::ostream::put((char)poVar13);
    std::ostream::flush();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_618._0_8_ !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_608) {
      operator_delete((void *)local_618._0_8_,(ulong)(local_608._0_8_ + 1));
    }
    pcVar4 = (pcVar36->super_cmCPackGenerator).Logger;
    std::__cxx11::stringbuf::str();
    uVar32 = local_618._0_8_;
    sVar14 = strlen((char *)local_618._0_8_);
    cmCPackLog::Log(pcVar4,4,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CPack/cmCPackNSISGenerator.cxx"
                    ,0x7c,(char *)uVar32,sVar14);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_618._0_8_ !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_608) {
      operator_delete((void *)local_618._0_8_,(ulong)(local_608._0_8_ + 1));
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_8c8);
    std::ios_base::~ios_base((ios_base *)&local_858);
    local_8c8 = (undefined1  [8])&local_8b8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_8c8,"CPACK_NSIS_DELETE_DIRECTORIES","");
    std::__cxx11::stringbuf::str();
    cmCPackGenerator::SetOptionIfNotSet
              (&pcVar36->super_cmCPackGenerator,(string *)local_8c8,(string *)local_618);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_618._0_8_ !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_608) {
      operator_delete((void *)local_618._0_8_,(ulong)(local_608._0_8_ + 1));
    }
    if (local_8c8 != (undefined1  [8])&local_8b8) {
      operator_delete((void *)local_8c8,(ulong)(local_8b8._M_allocated_capacity + 1));
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_8c8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_8c8,"Configure file: ",0x10)
    ;
    poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_8c8,local_3a8._M_dataplus._M_p,local_3a8._M_string_length)
    ;
    std::__ostream_insert<char,std::char_traits<char>>(poVar13," to ",4);
    poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                        (poVar13,local_9c8->_M_local_buf,(long)local_9c0);
    std::ios::widen((char)poVar13->_vptr_basic_ostream[-3] + (char)poVar13);
    std::ostream::put((char)poVar13);
    std::ostream::flush();
    pcVar4 = (pcVar36->super_cmCPackGenerator).Logger;
    std::__cxx11::stringbuf::str();
    uVar32 = local_618._0_8_;
    sVar14 = strlen((char *)local_618._0_8_);
    cmCPackLog::Log(pcVar4,2,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CPack/cmCPackNSISGenerator.cxx"
                    ,0x81,(char *)uVar32,sVar14);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_618._0_8_ !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_608) {
      operator_delete((void *)local_618._0_8_,(ulong)(local_608._0_8_ + 1));
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_8c8);
    std::ios_base::~ios_base((ios_base *)&local_858);
    local_8c8 = (undefined1  [8])&local_8b8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_8c8,"CPACK_NSIS_MUI_ICON","");
    bVar8 = cmCPackGenerator::IsSet(&pcVar36->super_cmCPackGenerator,(string *)local_8c8);
    bVar9 = true;
    if (!bVar8) {
      local_618._0_8_ = local_608;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_618,"CPACK_NSIS_MUI_UNIICON","");
      bVar9 = cmCPackGenerator::IsSet(&pcVar36->super_cmCPackGenerator,(string *)local_618);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_618._0_8_ !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_608) {
        operator_delete((void *)local_618._0_8_,(ulong)(local_608._0_8_ + 1));
      }
    }
    if (local_8c8 != (undefined1  [8])&local_8b8) {
      operator_delete((void *)local_8c8,(ulong)(local_8b8._M_allocated_capacity + 1));
    }
    if (bVar9 != false) {
      local_618._0_8_ = local_608;
      local_618._8_8_ = 0;
      local_608._0_8_ = local_608._0_8_ & 0xffffffffffffff00;
      local_8c8 = (undefined1  [8])&local_8b8;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_8c8,"CPACK_NSIS_MUI_ICON","");
      bVar8 = cmCPackGenerator::IsSet(&pcVar36->super_cmCPackGenerator,(string *)local_8c8);
      if (local_8c8 != (undefined1  [8])&local_8b8) {
        operator_delete((void *)local_8c8,(ulong)(local_8b8._M_allocated_capacity + 1));
      }
      if (bVar8) {
        local_968._M_dataplus._M_p = (pointer)&local_968.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_968,"CPACK_NSIS_MUI_ICON","");
        psVar11 = (string *)cmCPackGenerator::GetOption(&pcVar36->super_cmCPackGenerator,&local_968)
        ;
        local_8c8 = (undefined1  [8])0x12;
        local_8c0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)0x807a4d;
        local_8b8._M_allocated_capacity = 0;
        if (psVar11 == (string *)0x0) {
          psVar11 = &cmValue::Empty_abi_cxx11_;
        }
        local_8a8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(psVar11->_M_dataplus)._M_p;
        local_8b8._8_8_ = psVar11->_M_string_length;
        local_8a0 = 0;
        local_898._M_allocated_capacity = 2;
        local_898._8_8_ = "\"\n";
        local_888 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        views_00._M_len = 3;
        views_00._M_array = (iterator)local_8c8;
        cmCatViews(&local_a00,views_00);
        std::__cxx11::string::_M_append(local_618,(ulong)local_a00._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a00._M_dataplus._M_p != &local_a00.field_2) {
          operator_delete(local_a00._M_dataplus._M_p,local_a00.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_968._M_dataplus._M_p != &local_968.field_2) {
          operator_delete(local_968._M_dataplus._M_p,
                          CONCAT71(local_968.field_2._M_allocated_capacity._1_7_,
                                   local_968.field_2._M_local_buf[0]) + 1);
        }
      }
      local_8c8 = (undefined1  [8])&local_8b8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_8c8,"CPACK_NSIS_MUI_UNIICON","");
      bVar8 = cmCPackGenerator::IsSet(&pcVar36->super_cmCPackGenerator,(string *)local_8c8);
      if (local_8c8 != (undefined1  [8])&local_8b8) {
        operator_delete((void *)local_8c8,(ulong)(local_8b8._M_allocated_capacity + 1));
      }
      if (bVar8) {
        local_968._M_dataplus._M_p = (pointer)&local_968.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_968,"CPACK_NSIS_MUI_UNIICON","");
        psVar11 = (string *)cmCPackGenerator::GetOption(&pcVar36->super_cmCPackGenerator,&local_968)
        ;
        local_8c8 = (undefined1  [8])&DAT_00000014;
        local_8c0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)0x807a60;
        local_8b8._M_allocated_capacity = 0;
        if (psVar11 == (string *)0x0) {
          psVar11 = &cmValue::Empty_abi_cxx11_;
        }
        local_8a8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(psVar11->_M_dataplus)._M_p;
        local_8b8._8_8_ = psVar11->_M_string_length;
        local_8a0 = 0;
        local_898._M_allocated_capacity = 2;
        local_898._8_8_ = "\"\n";
        local_888 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        views_01._M_len = 3;
        views_01._M_array = (iterator)local_8c8;
        cmCatViews(&local_a00,views_01);
        std::__cxx11::string::_M_append(local_618,(ulong)local_a00._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a00._M_dataplus._M_p != &local_a00.field_2) {
          operator_delete(local_a00._M_dataplus._M_p,local_a00.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_968._M_dataplus._M_p != &local_968.field_2) {
          operator_delete(local_968._M_dataplus._M_p,
                          CONCAT71(local_968.field_2._M_allocated_capacity._1_7_,
                                   local_968.field_2._M_local_buf[0]) + 1);
        }
      }
      local_8c8 = (undefined1  [8])&local_8b8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_8c8,"CPACK_NSIS_INSTALLER_MUI_ICON_CODE","");
      cmCPackGenerator::SetOptionIfNotSet
                (&pcVar36->super_cmCPackGenerator,(string *)local_8c8,(char *)local_618._0_8_);
      if (local_8c8 != (undefined1  [8])&local_8b8) {
        operator_delete((void *)local_8c8,(ulong)(local_8b8._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_618._0_8_ !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_608) {
        operator_delete((void *)local_618._0_8_,(ulong)(local_608._0_8_ + 1));
      }
    }
    local_968._M_dataplus._M_p = (pointer)&local_968.field_2;
    local_968._M_string_length = 0;
    local_968.field_2._M_local_buf[0] = '\0';
    local_8c8 = (undefined1  [8])&local_8b8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_8c8,"CPACK_NSIS_MUI_HEADERIMAGE","");
    bVar8 = cmCPackGenerator::IsSet(&pcVar36->super_cmCPackGenerator,(string *)local_8c8);
    if (local_8c8 != (undefined1  [8])&local_8b8) {
      operator_delete((void *)local_8c8,(ulong)(local_8b8._M_allocated_capacity + 1));
    }
    local_8c8 = (undefined1  [8])&local_8b8;
    if (bVar8) {
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_8c8,"CPACK_NSIS_MUI_HEADERIMAGE","");
      cmCPackGenerator::GetOption(&pcVar36->super_cmCPackGenerator,(string *)local_8c8);
      std::__cxx11::string::_M_assign((string *)&local_968);
LAB_001ba460:
      if (local_8c8 != (undefined1  [8])&local_8b8) {
        operator_delete((void *)local_8c8,(ulong)(local_8b8._M_allocated_capacity + 1));
      }
    }
    else {
      std::__cxx11::string::_M_construct<char_const*>((string *)local_8c8,"CPACK_PACKAGE_ICON","");
      bVar8 = cmCPackGenerator::IsSet(&pcVar36->super_cmCPackGenerator,(string *)local_8c8);
      if (local_8c8 != (undefined1  [8])&local_8b8) {
        operator_delete((void *)local_8c8,(ulong)(local_8b8._M_allocated_capacity + 1));
      }
      if (bVar8) {
        local_8c8 = (undefined1  [8])&local_8b8;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_8c8,"CPACK_PACKAGE_ICON","")
        ;
        cmCPackGenerator::GetOption(&pcVar36->super_cmCPackGenerator,(string *)local_8c8);
        std::__cxx11::string::_M_assign((string *)&local_968);
        goto LAB_001ba460;
      }
    }
    if (local_968._M_string_length != 0) {
      local_8c8 = (undefined1  [8])0x20;
      local_8c0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)0x807ab3;
      local_8b8._M_allocated_capacity = 0;
      local_8b8._8_8_ = local_968._M_string_length;
      local_8a8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_968._M_dataplus._M_p;
      local_8a0 = 0;
      local_898._M_allocated_capacity = 2;
      local_898._8_8_ = "\"\n";
      local_888 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      views_02._M_len = 3;
      views_02._M_array = (iterator)local_8c8;
      cmCatViews((string *)local_618,views_02);
      local_8c8 = (undefined1  [8])&local_8b8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_8c8,"CPACK_NSIS_INSTALLER_ICON_CODE","");
      cmCPackGenerator::SetOptionIfNotSet
                (&pcVar36->super_cmCPackGenerator,(string *)local_8c8,(string *)local_618);
      if (local_8c8 != (undefined1  [8])&local_8b8) {
        operator_delete((void *)local_8c8,(ulong)(local_8b8._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_618._0_8_ !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_608) {
        operator_delete((void *)local_618._0_8_,(ulong)(local_608._0_8_ + 1));
      }
    }
    local_8c8 = (undefined1  [8])&local_8b8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_8c8,"CPACK_NSIS_MUI_WELCOMEFINISHPAGE_BITMAP","");
    bVar8 = cmCPackGenerator::IsSet(&pcVar36->super_cmCPackGenerator,(string *)local_8c8);
    if (local_8c8 != (undefined1  [8])&local_8b8) {
      operator_delete((void *)local_8c8,(ulong)(local_8b8._M_allocated_capacity + 1));
    }
    if (bVar8) {
      local_a00._M_dataplus._M_p = (pointer)&local_a00.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_a00,"CPACK_NSIS_MUI_WELCOMEFINISHPAGE_BITMAP","");
      psVar11 = (string *)cmCPackGenerator::GetOption(&pcVar36->super_cmCPackGenerator,&local_a00);
      local_8c8 = (undefined1  [8])0x26;
      local_8c0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)0x807b1b;
      local_8b8._M_allocated_capacity = 0;
      if (psVar11 == (string *)0x0) {
        psVar11 = &cmValue::Empty_abi_cxx11_;
      }
      local_8a8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(psVar11->_M_dataplus)._M_p;
      local_8b8._8_8_ = psVar11->_M_string_length;
      local_8a0 = 0;
      local_898._M_allocated_capacity = 2;
      local_898._8_8_ = "\"\n";
      local_888 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      views_03._M_len = 3;
      views_03._M_array = (iterator)local_8c8;
      cmCatViews((string *)local_618,views_03);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a00._M_dataplus._M_p != &local_a00.field_2) {
        operator_delete(local_a00._M_dataplus._M_p,local_a00.field_2._M_allocated_capacity + 1);
      }
      local_8c8 = (undefined1  [8])&local_8b8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_8c8,"CPACK_NSIS_INSTALLER_MUI_WELCOMEFINISH_CODE","");
      cmCPackGenerator::SetOptionIfNotSet
                (&pcVar36->super_cmCPackGenerator,(string *)local_8c8,(string *)local_618);
      if (local_8c8 != (undefined1  [8])&local_8b8) {
        operator_delete((void *)local_8c8,(ulong)(local_8b8._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_618._0_8_ !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_608) {
        operator_delete((void *)local_618._0_8_,(ulong)(local_608._0_8_ + 1));
      }
    }
    local_8c8 = (undefined1  [8])&local_8b8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_8c8,"CPACK_NSIS_MUI_UNWELCOMEFINISHPAGE_BITMAP","");
    bVar8 = cmCPackGenerator::IsSet(&pcVar36->super_cmCPackGenerator,(string *)local_8c8);
    if (local_8c8 != (undefined1  [8])&local_8b8) {
      operator_delete((void *)local_8c8,(ulong)(local_8b8._M_allocated_capacity + 1));
    }
    if (bVar8) {
      local_a00._M_dataplus._M_p = (pointer)&local_a00.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_a00,"CPACK_NSIS_MUI_UNWELCOMEFINISHPAGE_BITMAP","");
      psVar11 = (string *)cmCPackGenerator::GetOption(&pcVar36->super_cmCPackGenerator,&local_a00);
      local_8c8 = (undefined1  [8])&DAT_00000028;
      local_8c0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)0x807b98;
      local_8b8._M_allocated_capacity = 0;
      if (psVar11 == (string *)0x0) {
        psVar11 = &cmValue::Empty_abi_cxx11_;
      }
      local_8a8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(psVar11->_M_dataplus)._M_p;
      local_8b8._8_8_ = psVar11->_M_string_length;
      local_8a0 = 0;
      local_898._M_allocated_capacity = 2;
      local_898._8_8_ = "\"\n";
      local_888 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      views_04._M_len = 3;
      views_04._M_array = (iterator)local_8c8;
      cmCatViews((string *)local_618,views_04);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a00._M_dataplus._M_p != &local_a00.field_2) {
        operator_delete(local_a00._M_dataplus._M_p,local_a00.field_2._M_allocated_capacity + 1);
      }
      local_8c8 = (undefined1  [8])&local_8b8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_8c8,"CPACK_NSIS_INSTALLER_MUI_UNWELCOMEFINISH_CODE","");
      cmCPackGenerator::SetOptionIfNotSet
                (&pcVar36->super_cmCPackGenerator,(string *)local_8c8,(string *)local_618);
      if (local_8c8 != (undefined1  [8])&local_8b8) {
        operator_delete((void *)local_8c8,(ulong)(local_8b8._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_618._0_8_ !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_608) {
        operator_delete((void *)local_618._0_8_,(ulong)(local_608._0_8_ + 1));
      }
    }
    local_8c8 = (undefined1  [8])&local_8b8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_8c8,"CPACK_NSIS_MUI_FINISHPAGE_RUN","");
    bVar8 = cmCPackGenerator::IsSet(&pcVar36->super_cmCPackGenerator,(string *)local_8c8);
    if (local_8c8 != (undefined1  [8])&local_8b8) {
      operator_delete((void *)local_8c8,(ulong)(local_8b8._M_allocated_capacity + 1));
    }
    paVar25 = &local_948.field_2;
    if (bVar8) {
      local_948._M_dataplus._M_p = (pointer)paVar25;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_948,"CPACK_NSIS_EXECUTABLES_DIRECTORY","");
      psVar11 = (string *)cmCPackGenerator::GetOption(&pcVar36->super_cmCPackGenerator,&local_948);
      local_908._M_dataplus._M_p = (pointer)&local_908.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_908,"CPACK_NSIS_MUI_FINISHPAGE_RUN","");
      psVar18 = (string *)cmCPackGenerator::GetOption(&pcVar36->super_cmCPackGenerator,&local_908);
      local_8c8 = (undefined1  [8])0x25;
      local_8c0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)0x807c0d;
      local_8b8._M_allocated_capacity = 0;
      if (psVar11 == (string *)0x0) {
        psVar11 = &cmValue::Empty_abi_cxx11_;
      }
      local_8a8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(psVar11->_M_dataplus)._M_p;
      local_8b8._8_8_ = psVar11->_M_string_length;
      local_8a0 = 0;
      local_898._8_8_ = local_608 + 8;
      local_618._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0x0;
      local_618._8_8_ = 1;
      local_608[8] = '\\';
      local_898._M_allocated_capacity = 1;
      local_888 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (psVar18 == (string *)0x0) {
        psVar18 = &cmValue::Empty_abi_cxx11_;
      }
      local_878._M_dataplus._M_p = (psVar18->_M_dataplus)._M_p;
      local_880 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar18->_M_string_length;
      local_878._M_string_length = 0;
      local_878.field_2._M_allocated_capacity = 2;
      local_878.field_2._8_8_ = "\"\n";
      local_858 = 0;
      views_05._M_len = 5;
      views_05._M_array = (iterator)local_8c8;
      local_608._0_8_ = local_898._8_8_;
      cmCatViews(&local_a00,views_05);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_908._M_dataplus._M_p != &local_908.field_2) {
        operator_delete(local_908._M_dataplus._M_p,
                        CONCAT71(local_908.field_2._M_allocated_capacity._1_7_,
                                 local_908.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_948._M_dataplus._M_p != paVar25) {
        operator_delete(local_948._M_dataplus._M_p,
                        CONCAT71(local_948.field_2._M_allocated_capacity._1_7_,
                                 local_948.field_2._M_local_buf[0]) + 1);
      }
      local_8c8 = (undefined1  [8])&local_8b8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_8c8,"CPACK_NSIS_INSTALLER_MUI_FINISHPAGE_RUN_CODE","");
      cmCPackGenerator::SetOptionIfNotSet
                (&pcVar36->super_cmCPackGenerator,(string *)local_8c8,&local_a00);
      if (local_8c8 != (undefined1  [8])&local_8b8) {
        operator_delete((void *)local_8c8,(ulong)(local_8b8._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a00._M_dataplus._M_p != &local_a00.field_2) {
        operator_delete(local_a00._M_dataplus._M_p,local_a00.field_2._M_allocated_capacity + 1);
      }
    }
    local_8c8 = (undefined1  [8])&local_8b8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_8c8,"CPACK_NSIS_WELCOME_TITLE","");
    bVar8 = cmCPackGenerator::IsSet(&pcVar36->super_cmCPackGenerator,(string *)local_8c8);
    if (local_8c8 != (undefined1  [8])&local_8b8) {
      operator_delete((void *)local_8c8,(ulong)(local_8b8._M_allocated_capacity + 1));
    }
    if (bVar8) {
      local_a00._M_dataplus._M_p = (pointer)&local_a00.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_a00,"CPACK_NSIS_WELCOME_TITLE","");
      psVar11 = (string *)cmCPackGenerator::GetOption(&pcVar36->super_cmCPackGenerator,&local_a00);
      local_8c8 = (undefined1  [8])0x1f;
      local_8c0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)0x807c9a;
      local_8b8._M_allocated_capacity = 0;
      if (psVar11 == (string *)0x0) {
        psVar11 = &cmValue::Empty_abi_cxx11_;
      }
      local_8a8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(psVar11->_M_dataplus)._M_p;
      local_8b8._8_8_ = psVar11->_M_string_length;
      local_8a0 = 0;
      local_898._M_allocated_capacity = 1;
      local_898._8_8_ = "\"";
      local_888 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      views_06._M_len = 3;
      views_06._M_array = (iterator)local_8c8;
      cmCatViews((string *)local_618,views_06);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a00._M_dataplus._M_p != &local_a00.field_2) {
        operator_delete(local_a00._M_dataplus._M_p,local_a00.field_2._M_allocated_capacity + 1);
      }
      local_8c8 = (undefined1  [8])&local_8b8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_8c8,"CPACK_NSIS_INSTALLER_WELCOME_TITLE_CODE","");
      cmCPackGenerator::SetOptionIfNotSet
                (&pcVar36->super_cmCPackGenerator,(string *)local_8c8,(string *)local_618);
      if (local_8c8 != (undefined1  [8])&local_8b8) {
        operator_delete((void *)local_8c8,(ulong)(local_8b8._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_618._0_8_ !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_608) {
        operator_delete((void *)local_618._0_8_,(ulong)(local_608._0_8_ + 1));
      }
    }
    local_8c8 = (undefined1  [8])&local_8b8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_8c8,"CPACK_NSIS_WELCOME_TITLE_3LINES","");
    bVar8 = cmCPackGenerator::IsSet(&pcVar36->super_cmCPackGenerator,(string *)local_8c8);
    if (local_8c8 != (undefined1  [8])&local_8b8) {
      operator_delete((void *)local_8c8,(ulong)(local_8b8._M_allocated_capacity + 1));
    }
    if (bVar8) {
      local_8c8 = (undefined1  [8])&local_8b8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_8c8,"CPACK_NSIS_INSTALLER_WELCOME_TITLE_3LINES_CODE","");
      cmCPackGenerator::SetOptionIfNotSet
                (&pcVar36->super_cmCPackGenerator,(string *)local_8c8,
                 "!define MUI_WELCOMEPAGE_TITLE_3LINES");
      if (local_8c8 != (undefined1  [8])&local_8b8) {
        operator_delete((void *)local_8c8,(ulong)(local_8b8._M_allocated_capacity + 1));
      }
    }
    local_8c8 = (undefined1  [8])&local_8b8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_8c8,"CPACK_NSIS_FINISH_TITLE","");
    bVar8 = cmCPackGenerator::IsSet(&pcVar36->super_cmCPackGenerator,(string *)local_8c8);
    if (local_8c8 != (undefined1  [8])&local_8b8) {
      operator_delete((void *)local_8c8,(ulong)(local_8b8._M_allocated_capacity + 1));
    }
    if (bVar8) {
      local_a00._M_dataplus._M_p = (pointer)&local_a00.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_a00,"CPACK_NSIS_FINISH_TITLE","");
      psVar11 = (string *)cmCPackGenerator::GetOption(&pcVar36->super_cmCPackGenerator,&local_a00);
      local_8c8 = (undefined1  [8])&DAT_0000001e;
      local_8c0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)0x807d6e;
      local_8b8._M_allocated_capacity = 0;
      if (psVar11 == (string *)0x0) {
        psVar11 = &cmValue::Empty_abi_cxx11_;
      }
      local_8a8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(psVar11->_M_dataplus)._M_p;
      local_8b8._8_8_ = psVar11->_M_string_length;
      local_8a0 = 0;
      local_898._M_allocated_capacity = 1;
      local_898._8_8_ = "\"";
      local_888 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      views_07._M_len = 3;
      views_07._M_array = (iterator)local_8c8;
      cmCatViews((string *)local_618,views_07);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a00._M_dataplus._M_p != &local_a00.field_2) {
        operator_delete(local_a00._M_dataplus._M_p,local_a00.field_2._M_allocated_capacity + 1);
      }
      local_8c8 = (undefined1  [8])&local_8b8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_8c8,"CPACK_NSIS_INSTALLER_FINISH_TITLE_CODE","");
      cmCPackGenerator::SetOptionIfNotSet
                (&pcVar36->super_cmCPackGenerator,(string *)local_8c8,(string *)local_618);
      if (local_8c8 != (undefined1  [8])&local_8b8) {
        operator_delete((void *)local_8c8,(ulong)(local_8b8._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_618._0_8_ !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_608) {
        operator_delete((void *)local_618._0_8_,(ulong)(local_608._0_8_ + 1));
      }
    }
    local_8c8 = (undefined1  [8])&local_8b8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_8c8,"CPACK_NSIS_FINISH_TITLE_3LINES","");
    bVar8 = cmCPackGenerator::IsSet(&pcVar36->super_cmCPackGenerator,(string *)local_8c8);
    if (local_8c8 != (undefined1  [8])&local_8b8) {
      operator_delete((void *)local_8c8,(ulong)(local_8b8._M_allocated_capacity + 1));
    }
    if (bVar8) {
      local_8c8 = (undefined1  [8])&local_8b8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_8c8,"CPACK_NSIS_INSTALLER_FINISH_TITLE_3LINES_CODE","");
      cmCPackGenerator::SetOptionIfNotSet
                (&pcVar36->super_cmCPackGenerator,(string *)local_8c8,
                 "!define MUI_FINISHPAGE_TITLE_3LINES");
      if (local_8c8 != (undefined1  [8])&local_8b8) {
        operator_delete((void *)local_8c8,(ulong)(local_8b8._M_allocated_capacity + 1));
      }
    }
    local_8c8 = (undefined1  [8])&local_8b8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_8c8,"CPACK_NSIS_MANIFEST_DPI_AWARE","");
    bVar8 = cmCPackGenerator::IsSet(&pcVar36->super_cmCPackGenerator,(string *)local_8c8);
    if (local_8c8 != (undefined1  [8])&local_8b8) {
      operator_delete((void *)local_8c8,(ulong)(local_8b8._M_allocated_capacity + 1));
    }
    if (bVar8) {
      local_8c8 = (undefined1  [8])&local_8b8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_8c8,"CPACK_NSIS_MANIFEST_DPI_AWARE_CODE","");
      cmCPackGenerator::SetOptionIfNotSet
                (&pcVar36->super_cmCPackGenerator,(string *)local_8c8,"ManifestDPIAware true");
      if (local_8c8 != (undefined1  [8])&local_8b8) {
        operator_delete((void *)local_8c8,(ulong)(local_8b8._M_allocated_capacity + 1));
      }
    }
    local_8c8 = (undefined1  [8])&local_8b8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_8c8,"CPACK_NSIS_BRANDING_TEXT","");
    bVar8 = cmCPackGenerator::IsSet(&pcVar36->super_cmCPackGenerator,(string *)local_8c8);
    if (local_8c8 != (undefined1  [8])&local_8b8) {
      operator_delete((void *)local_8c8,(ulong)(local_8b8._M_allocated_capacity + 1));
    }
    if (bVar8) {
      paVar16 = &local_a00.field_2;
      local_a00._M_dataplus._M_p = (pointer)paVar16;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_a00,"LEFT","");
      local_8c8 = (undefined1  [8])&local_8b8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_8c8,"CPACK_NSIS_BRANDING_TEXT_TRIM_POSITION","");
      bVar8 = cmCPackGenerator::IsSet(&pcVar36->super_cmCPackGenerator,(string *)local_8c8);
      if (local_8c8 != (undefined1  [8])&local_8b8) {
        operator_delete((void *)local_8c8,(ulong)(local_8b8._M_allocated_capacity + 1));
      }
      if (!bVar8) {
LAB_001bb33e:
        local_948._M_dataplus._M_p = (pointer)paVar25;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_948,"CPACK_NSIS_BRANDING_TEXT","");
        psVar11 = (string *)cmCPackGenerator::GetOption(&pcVar36->super_cmCPackGenerator,&local_948)
        ;
        local_8c8 = (undefined1  [8])0x12;
        local_8c0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)0x807eec;
        local_8b8._M_allocated_capacity = 0;
        local_8b8._8_8_ = local_a00._M_string_length;
        local_8a8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_a00._M_dataplus._M_p;
        local_8a0 = 0;
        local_898._M_allocated_capacity = 2;
        local_898._8_8_ = " \"";
        local_888 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        if (psVar11 == (string *)0x0) {
          psVar11 = &cmValue::Empty_abi_cxx11_;
        }
        local_878._M_dataplus._M_p = (psVar11->_M_dataplus)._M_p;
        local_880 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)psVar11->_M_string_length;
        local_878._M_string_length = 0;
        local_878.field_2._M_allocated_capacity = 2;
        local_878.field_2._8_8_ = "\"\n";
        local_858 = 0;
        views_08._M_len = 5;
        views_08._M_array = (iterator)local_8c8;
        cmCatViews((string *)local_618,views_08);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_948._M_dataplus._M_p != paVar25) {
          operator_delete(local_948._M_dataplus._M_p,
                          CONCAT71(local_948.field_2._M_allocated_capacity._1_7_,
                                   local_948.field_2._M_local_buf[0]) + 1);
        }
        local_8c8 = (undefined1  [8])&local_8b8;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_8c8,"CPACK_NSIS_BRANDING_TEXT_CODE","");
        cmCPackGenerator::SetOptionIfNotSet
                  (&pcVar36->super_cmCPackGenerator,(string *)local_8c8,(string *)local_618);
        if (local_8c8 != (undefined1  [8])&local_8b8) {
          operator_delete((void *)local_8c8,(ulong)(local_8b8._M_allocated_capacity + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_618._0_8_ !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_608) {
          operator_delete((void *)local_618._0_8_,(ulong)(local_608._0_8_ + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a00._M_dataplus._M_p != paVar16) {
          operator_delete(local_a00._M_dataplus._M_p,local_a00.field_2._M_allocated_capacity + 1);
        }
        goto LAB_001bb4df;
      }
      local_8c8 = (undefined1  [8])&local_8b8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_8c8,"CPACK_NSIS_BRANDING_TEXT_TRIM_POSITION","");
      psVar11 = (string *)
                cmCPackGenerator::GetOption(&pcVar36->super_cmCPackGenerator,(string *)local_8c8);
      if (psVar11 == (string *)0x0) {
        psVar11 = &cmValue::Empty_abi_cxx11_;
      }
      pcVar3 = (psVar11->_M_dataplus)._M_p;
      local_948._M_dataplus._M_p = (pointer)paVar25;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_948,pcVar3,pcVar3 + psVar11->_M_string_length);
      if (local_8c8 != (undefined1  [8])&local_8b8) {
        operator_delete((void *)local_8c8,(ulong)(local_8b8._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_948._M_string_length ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
LAB_001bb321:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_948._M_dataplus._M_p != paVar25) {
          operator_delete(local_948._M_dataplus._M_p,
                          CONCAT71(local_948.field_2._M_allocated_capacity._1_7_,
                                   local_948.field_2._M_local_buf[0]) + 1);
        }
        goto LAB_001bb33e;
      }
      local_8c8 = (undefined1  [8])&local_8b8;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_8c8,"CENTER","");
      local_8a8 = &local_898;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_8a8,"LEFT","");
      pbVar29 = &local_878;
      local_888 = pbVar29;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_888,"RIGHT","");
      __l._M_len = 3;
      __l._M_array = (iterator)local_8c8;
      std::
      set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_618,__l,
            (less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_908,(allocator_type *)local_8e8._M_local_buf);
      lVar15 = -0x60;
      do {
        if (pbVar29 !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            pbVar29[-1].field_2._M_allocated_capacity) {
          operator_delete((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          pbVar29[-1].field_2._M_allocated_capacity,
                          (ulong)((pbVar29->_M_dataplus)._M_p + 1));
        }
        pbVar29 = pbVar29 + -1;
        lVar15 = lVar15 + 0x20;
      } while (lVar15 != 0);
      cVar19 = std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_618,&local_948);
      if (cVar19._M_node != (_Base_ptr)(local_618 + 8)) {
        std::__cxx11::string::_M_assign((string *)&local_a00);
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_618);
        goto LAB_001bb321;
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_8c8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_8c8,"Unsupported branding text trim position ",0x28);
      poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_8c8,local_948._M_dataplus._M_p,
                           local_948._M_string_length);
      std::endl<char,std::char_traits<char>>(poVar13);
      pcVar4 = (pcVar36->super_cmCPackGenerator).Logger;
      std::__cxx11::stringbuf::str();
      _Var30._M_p = local_908._M_dataplus._M_p;
      sVar14 = strlen(local_908._M_dataplus._M_p);
      cmCPackLog::Log(pcVar4,0x10,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CPack/cmCPackNSISGenerator.cxx"
                      ,0xe3,_Var30._M_p,sVar14);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_908._M_dataplus._M_p != &local_908.field_2) {
        operator_delete(local_908._M_dataplus._M_p,
                        CONCAT71(local_908.field_2._M_allocated_capacity._1_7_,
                                 local_908.field_2._M_local_buf[0]) + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_8c8);
      std::ios_base::~ios_base((ios_base *)&local_858);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_618);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_948._M_dataplus._M_p != paVar25) {
        operator_delete(local_948._M_dataplus._M_p,
                        CONCAT71(local_948.field_2._M_allocated_capacity._1_7_,
                                 local_948.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a00._M_dataplus._M_p != paVar16) {
        operator_delete(local_a00._M_dataplus._M_p,local_a00.field_2._M_allocated_capacity + 1);
      }
      iVar10 = 0;
    }
    else {
LAB_001bb4df:
      local_8c8 = (undefined1  [8])&local_8b8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_8c8,"CPACK_NSIS_IGNORE_LICENSE_PAGE","");
      bVar8 = cmCPackGenerator::IsSet(&pcVar36->super_cmCPackGenerator,(string *)local_8c8);
      if (local_8c8 != (undefined1  [8])&local_8b8) {
        operator_delete((void *)local_8c8,(ulong)(local_8b8._M_allocated_capacity + 1));
      }
      if (!bVar8) {
        local_a00._M_dataplus._M_p = (pointer)&local_a00.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_a00,"CPACK_RESOURCE_FILE_LICENSE","");
        psVar11 = (string *)cmCPackGenerator::GetOption(&pcVar36->super_cmCPackGenerator,&local_a00)
        ;
        local_8c8 = (undefined1  [8])0x1f;
        local_8c0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)0x807f3c;
        local_8b8._M_allocated_capacity = 0;
        if (psVar11 == (string *)0x0) {
          psVar11 = &cmValue::Empty_abi_cxx11_;
        }
        local_8a8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(psVar11->_M_dataplus)._M_p;
        local_8b8._8_8_ = psVar11->_M_string_length;
        local_8a0 = 0;
        local_898._M_allocated_capacity = 2;
        local_898._8_8_ = "\"\n";
        local_888 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        views_09._M_len = 3;
        views_09._M_array = (iterator)local_8c8;
        cmCatViews((string *)local_618,views_09);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a00._M_dataplus._M_p != &local_a00.field_2) {
          operator_delete(local_a00._M_dataplus._M_p,local_a00.field_2._M_allocated_capacity + 1);
        }
        local_8c8 = (undefined1  [8])&local_8b8;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_8c8,"CPACK_NSIS_LICENSE_PAGE","");
        cmCPackGenerator::SetOptionIfNotSet
                  (&pcVar36->super_cmCPackGenerator,(string *)local_8c8,(string *)local_618);
        if (local_8c8 != (undefined1  [8])&local_8b8) {
          operator_delete((void *)local_8c8,(ulong)(local_8b8._M_allocated_capacity + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_618._0_8_ !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_608) {
          operator_delete((void *)local_618._0_8_,(ulong)(local_608._0_8_ + 1));
        }
      }
      local_948._M_string_length = 0;
      local_948.field_2._M_local_buf[0] = '\0';
      local_8c8 = (undefined1  [8])&local_8b8;
      local_948._M_dataplus._M_p = (pointer)paVar25;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_8c8,"CPACK_NSIS_EXECUTABLE_PRE_ARGUMENTS","");
      cVar20 = cmCPackGenerator::GetOption(&pcVar36->super_cmCPackGenerator,(string *)local_8c8);
      if (local_8c8 != (undefined1  [8])&local_8b8) {
        operator_delete((void *)local_8c8,(ulong)(local_8b8._M_allocated_capacity + 1));
      }
      if (cVar20.Value != (string *)0x0) {
        local_8c8 = (undefined1  [8])&local_8b8;
        pcVar3 = ((cVar20.Value)->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_8c8,pcVar3,pcVar3 + (cVar20.Value)->_M_string_length);
        init._M_len = 1;
        init._M_array = (iterator)local_8c8;
        cmList::cmList((cmList *)&local_908,init);
        if (local_8c8 != (undefined1  [8])&local_8b8) {
          operator_delete((void *)local_8c8,(ulong)(local_8b8._M_allocated_capacity + 1));
        }
        if (local_908._M_dataplus._M_p != (pointer)local_908._M_string_length) {
          _Var30._M_p = local_908._M_dataplus._M_p;
          do {
            local_8c0 = *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                          **)_Var30._M_p;
            local_8c8 = *(undefined1 (*) [8])((long)_Var30._M_p + 8);
            __str._M_str = "-";
            __str._M_len = 1;
            iVar10 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                               ((basic_string_view<char,_std::char_traits<char>_> *)local_8c8,0,1,
                                __str);
            if (iVar10 != 0) {
              local_8c8 = (undefined1  [8])local_948._M_string_length;
              local_8c0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_948._M_dataplus._M_p;
              local_8b8._M_allocated_capacity = 0;
              local_8b8._8_8_ = 1;
              local_8a8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)0x864dc3;
              local_8a0 = 0;
              views_10._M_len = 2;
              views_10._M_array = (iterator)local_8c8;
              cmCatViews((string *)local_618,views_10);
              std::__cxx11::string::operator=((string *)&local_948,(string *)local_618);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_618._0_8_ !=
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_608) {
                operator_delete((void *)local_618._0_8_,(ulong)(local_608._0_8_ + 1));
              }
            }
            local_8c8 = (undefined1  [8])local_948._M_string_length;
            local_8c0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_948._M_dataplus._M_p;
            local_8b8._M_allocated_capacity = 0;
            local_8a8 = *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                          **)_Var30._M_p;
            local_8b8._8_8_ = *(long *)((long)_Var30._M_p + 8);
            local_8a0 = 0;
            local_618._0_8_ =
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)0x0;
            local_618._8_8_ = 1;
            local_898._8_8_ = local_608 + 8;
            local_608[8] = ' ';
            local_898._M_allocated_capacity = 1;
            local_888 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
            views_11._M_len = 3;
            views_11._M_array = (iterator)local_8c8;
            local_608._0_8_ = local_898._8_8_;
            cmCatViews(&local_a00,views_11);
            std::__cxx11::string::operator=((string *)&local_948,(string *)&local_a00);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_a00._M_dataplus._M_p != &local_a00.field_2) {
              operator_delete(local_a00._M_dataplus._M_p,local_a00.field_2._M_allocated_capacity + 1
                             );
            }
            _Var30._M_p = _Var30._M_p + 0x20;
          } while (_Var30._M_p != (pointer)local_908._M_string_length);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&local_908);
        pcVar36 = local_a08;
      }
      local_908._M_dataplus._M_p = (pointer)&local_908.field_2;
      local_908._M_string_length = 0;
      local_908.field_2._M_local_buf[0] = '\0';
      local_8c8 = (undefined1  [8])&local_8b8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_8c8,"CPACK_NSIS_EXECUTABLE_POST_ARGUMENTS","");
      cVar20 = cmCPackGenerator::GetOption(&pcVar36->super_cmCPackGenerator,(string *)local_8c8);
      if (local_8c8 != (undefined1  [8])&local_8b8) {
        operator_delete((void *)local_8c8,(ulong)(local_8b8._M_allocated_capacity + 1));
      }
      if (cVar20.Value != (string *)0x0) {
        local_8c8 = (undefined1  [8])&local_8b8;
        pcVar3 = ((cVar20.Value)->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_8c8,pcVar3,pcVar3 + (cVar20.Value)->_M_string_length);
        init_00._M_len = 1;
        init_00._M_array = (iterator)local_8c8;
        cmList::cmList((cmList *)&local_8e8,init_00);
        if (local_8c8 != (undefined1  [8])&local_8b8) {
          operator_delete((void *)local_8c8,(ulong)(local_8b8._M_allocated_capacity + 1));
        }
        uVar32 = local_8e8._8_8_;
        if (local_8e8._M_allocated_capacity != local_8e8._8_8_) {
          uVar31 = local_8e8._M_allocated_capacity;
          do {
            local_8c0 = *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                          **)uVar31;
            local_8c8 = *(undefined1 (*) [8])(uVar31 + 8);
            __str_00._M_str = "-";
            __str_00._M_len = 1;
            iVar10 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                               ((basic_string_view<char,_std::char_traits<char>_> *)local_8c8,0,1,
                                __str_00);
            if (iVar10 != 0) {
              local_8c8 = (undefined1  [8])local_908._M_string_length;
              local_8c0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_908._M_dataplus._M_p;
              local_8b8._M_allocated_capacity = 0;
              local_8b8._8_8_ = 1;
              local_8a8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)0x864dc3;
              local_8a0 = 0;
              views_12._M_len = 2;
              views_12._M_array = (iterator)local_8c8;
              cmCatViews((string *)local_618,views_12);
              std::__cxx11::string::operator=((string *)&local_908,(string *)local_618);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_618._0_8_ !=
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_608) {
                operator_delete((void *)local_618._0_8_,(ulong)(local_608._0_8_ + 1));
              }
            }
            local_8c8 = (undefined1  [8])local_908._M_string_length;
            local_8c0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_908._M_dataplus._M_p;
            local_8b8._M_allocated_capacity = 0;
            local_8a8 = *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                          **)uVar31;
            local_8b8._8_8_ = *(long *)(uVar31 + 8);
            local_8a0 = 0;
            local_618._0_8_ =
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)0x0;
            local_618._8_8_ = 1;
            local_898._8_8_ = local_608 + 8;
            local_608[8] = ' ';
            local_898._M_allocated_capacity = 1;
            local_888 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
            views_13._M_len = 3;
            views_13._M_array = (iterator)local_8c8;
            local_608._0_8_ = local_898._8_8_;
            cmCatViews(&local_a00,views_13);
            std::__cxx11::string::operator=((string *)&local_908,(string *)&local_a00);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_a00._M_dataplus._M_p != &local_a00.field_2) {
              operator_delete(local_a00._M_dataplus._M_p,local_a00.field_2._M_allocated_capacity + 1
                             );
            }
            uVar31 = uVar31 + 0x20;
          } while (uVar31 != uVar32);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&local_8e8);
        pcVar36 = local_a08;
      }
      if ((pcVar36->super_cmCPackGenerator).Components._M_t._M_impl.super__Rb_tree_header.
          _M_node_count == 0) {
        local_8c8 = (undefined1  [8])&local_8b8;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_8c8,"CPACK_NSIS_INSTALLATION_TYPES","");
        cmCPackGenerator::SetOptionIfNotSet(&pcVar36->super_cmCPackGenerator,(string *)local_8c8,"")
        ;
        if (local_8c8 != (undefined1  [8])&local_8b8) {
          operator_delete((void *)local_8c8,(ulong)(local_8b8._M_allocated_capacity + 1));
        }
        local_8c8 = (undefined1  [8])&local_8b8;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_8c8,"CPACK_NSIS_INSTALLER_MUI_COMPONENTS_DESC","");
        cmCPackGenerator::SetOptionIfNotSet(&pcVar36->super_cmCPackGenerator,(string *)local_8c8,"")
        ;
        if (local_8c8 != (undefined1  [8])&local_8b8) {
          operator_delete((void *)local_8c8,(ulong)(local_8b8._M_allocated_capacity + 1));
        }
        local_8c8 = (undefined1  [8])&local_8b8;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_8c8,"CPACK_NSIS_PAGE_COMPONENTS","");
        cmCPackGenerator::SetOptionIfNotSet(&pcVar36->super_cmCPackGenerator,(string *)local_8c8,"")
        ;
        if (local_8c8 != (undefined1  [8])&local_8b8) {
          operator_delete((void *)local_8c8,(ulong)(local_8b8._M_allocated_capacity + 1));
        }
        local_8c8 = (undefined1  [8])&local_8b8;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_8c8,"CPACK_NSIS_FULL_INSTALL","");
        cmCPackGenerator::SetOptionIfNotSet
                  (&pcVar36->super_cmCPackGenerator,(string *)local_8c8,
                   "File /r \"${INST_DIR}\\*.*\"");
        if (local_8c8 != (undefined1  [8])&local_8b8) {
          operator_delete((void *)local_8c8,(ulong)(local_8b8._M_allocated_capacity + 1));
        }
        local_8c8 = (undefined1  [8])&local_8b8;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_8c8,"CPACK_NSIS_COMPONENT_SECTIONS","");
        cmCPackGenerator::SetOptionIfNotSet(&pcVar36->super_cmCPackGenerator,(string *)local_8c8,"")
        ;
        if (local_8c8 != (undefined1  [8])&local_8b8) {
          operator_delete((void *)local_8c8,(ulong)(local_8b8._M_allocated_capacity + 1));
        }
        local_8c8 = (undefined1  [8])&local_8b8;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_8c8,"CPACK_NSIS_COMPONENT_SECTION_LIST","");
        cmCPackGenerator::SetOptionIfNotSet(&pcVar36->super_cmCPackGenerator,(string *)local_8c8,"")
        ;
        if (local_8c8 != (undefined1  [8])&local_8b8) {
          operator_delete((void *)local_8c8,(ulong)(local_8b8._M_allocated_capacity + 1));
        }
        local_8c8 = (undefined1  [8])&local_8b8;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_8c8,"CPACK_NSIS_SECTION_SELECTED_VARS","");
        cmCPackGenerator::SetOptionIfNotSet(&pcVar36->super_cmCPackGenerator,(string *)local_8c8,"")
        ;
        uVar32 = local_8b8._M_allocated_capacity;
        auVar33 = local_8c8;
        if (local_8c8 != (undefined1  [8])&local_8b8) goto LAB_001bcea1;
      }
      else {
        local_618._0_8_ = local_608;
        local_618._8_8_ = 0;
        local_608._0_8_ = local_608._0_8_ & 0xffffffffffffff00;
        local_a00._M_dataplus._M_p = (pointer)&local_a00.field_2;
        local_a00._M_string_length = 0;
        local_a00.field_2._M_allocated_capacity =
             local_a00.field_2._M_allocated_capacity & 0xffffffffffffff00;
        local_8e8._M_allocated_capacity = (size_type)&local_8d8;
        local_8e8._8_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x0;
        local_8d8._M_local_buf[0] = '\0';
        local_660._M_dataplus._M_p = (pointer)&local_660.field_2;
        local_660._M_string_length = 0;
        local_660.field_2._M_local_buf[0] = '\0';
        local_480 = &local_470;
        local_478 = 0;
        local_470 = 0;
        local_3e8 = &local_3d8;
        local_3e0 = 0;
        local_3d8 = 0;
        local_448 = &local_438;
        local_440 = 0;
        local_438 = 0;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_8c8);
        std::vector<cmCPackInstallationType_*,_std::allocator<cmCPackInstallationType_*>_>::vector
                  (&local_460,
                   (pcVar36->super_cmCPackGenerator).InstallationTypes._M_t._M_impl.
                   super__Rb_tree_header._M_node_count,(allocator_type *)&local_a28);
        for (p_Var21 = (pcVar36->super_cmCPackGenerator).InstallationTypes._M_t._M_impl.
                       super__Rb_tree_header._M_header._M_left;
            (_Rb_tree_header *)p_Var21 !=
            &(pcVar36->super_cmCPackGenerator).InstallationTypes._M_t._M_impl.super__Rb_tree_header;
            p_Var21 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var21)) {
          local_460.
          super__Vector_base<cmCPackInstallationType_*,_std::allocator<cmCPackInstallationType_*>_>.
          _M_impl.super__Vector_impl_data._M_start[p_Var21[4]._M_color - _S_black] =
               (cmCPackInstallationType *)(p_Var21 + 2);
        }
        if (local_460.
            super__Vector_base<cmCPackInstallationType_*,_std::allocator<cmCPackInstallationType_*>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            local_460.
            super__Vector_base<cmCPackInstallationType_*,_std::allocator<cmCPackInstallationType_*>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          ppcVar34 = local_460.
                     super__Vector_base<cmCPackInstallationType_*,_std::allocator<cmCPackInstallationType_*>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          do {
            pcVar5 = *ppcVar34;
            std::__cxx11::string::append((char *)&local_3e8);
            std::__cxx11::string::_M_append
                      ((char *)&local_3e8,(ulong)(pcVar5->DisplayName)._M_dataplus._M_p);
            std::__cxx11::string::append((char *)&local_3e8);
            ppcVar34 = ppcVar34 + 1;
          } while (ppcVar34 !=
                   local_460.
                   super__Vector_base<cmCPackInstallationType_*,_std::allocator<cmCPackInstallationType_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish);
        }
        p_Var24 = (local_a08->super_cmCPackGenerator).ComponentGroups._M_t._M_impl.
                  super__Rb_tree_header._M_header._M_left;
        p_Var1 = &(local_a08->super_cmCPackGenerator).ComponentGroups._M_t._M_impl.
                  super__Rb_tree_header;
        if ((_Rb_tree_header *)p_Var24 != p_Var1) {
          paVar25 = &local_a28.field_2;
          do {
            if (*(long *)(p_Var24 + 6) == 0) {
              CreateComponentGroupDescription_abi_cxx11_
                        (&local_a28,local_a08,(cmCPackComponentGroup *)(p_Var24 + 2),
                         (ostream *)local_8c8);
              std::__cxx11::string::_M_append(local_618,(ulong)local_a28._M_dataplus._M_p);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_a28._M_dataplus._M_p != paVar25) {
                operator_delete(local_a28._M_dataplus._M_p,
                                local_a28.field_2._M_allocated_capacity + 1);
              }
            }
            if (p_Var24[4]._M_parent != (_Base_ptr)0x0) {
              std::operator+(&local_4a0,"  !insertmacro MUI_DESCRIPTION_TEXT ${",
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             (p_Var24 + 1));
              plVar22 = (long *)std::__cxx11::string::append((char *)&local_4a0);
              puVar26 = (ulong *)(plVar22 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar22 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)puVar26) {
                local_918._M_allocated_capacity = *puVar26;
                local_918._8_4_ = (undefined4)plVar22[3];
                local_918._12_4_ = *(undefined4 *)((long)plVar22 + 0x1c);
                local_928._M_allocated_capacity = (size_type)&local_918;
              }
              else {
                local_918._M_allocated_capacity = *puVar26;
                local_928._M_allocated_capacity =
                     (size_type)
                     (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)*plVar22;
              }
              local_928._8_8_ = plVar22[1];
              *plVar22 = (long)puVar26;
              plVar22[1] = 0;
              *(undefined1 *)(plVar22 + 2) = 0;
              local_408._M_dataplus._M_p = (pointer)&local_408.field_2;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_408,*(long *)(p_Var24 + 4),
                         (long)&(p_Var24[4]._M_parent)->_M_color + *(long *)(p_Var24 + 4));
              TranslateNewlines(&local_638,&local_408);
              uVar32 = 0xf;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_928._M_allocated_capacity != &local_918) {
                uVar32 = local_918._M_allocated_capacity;
              }
              if ((ulong)uVar32 < local_638._M_string_length + local_928._8_8_) {
                uVar32 = 0xf;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_638._M_dataplus._M_p != &local_638.field_2) {
                  uVar32 = local_638.field_2._M_allocated_capacity;
                }
                if ((ulong)uVar32 < local_638._M_string_length + local_928._8_8_) goto LAB_001bbf16;
                puVar23 = (undefined8 *)
                          std::__cxx11::string::replace
                                    ((ulong)&local_638,0,(char *)0x0,local_928._M_allocated_capacity
                                    );
              }
              else {
LAB_001bbf16:
                puVar23 = (undefined8 *)
                          std::__cxx11::string::_M_append
                                    (local_928._M_local_buf,(ulong)local_638._M_dataplus._M_p);
              }
              psVar27 = puVar23 + 2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar23 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar27) {
                local_988.field_2._M_allocated_capacity = *psVar27;
                local_988.field_2._8_8_ = puVar23[3];
                local_988._M_dataplus._M_p = (pointer)&local_988.field_2;
              }
              else {
                local_988.field_2._M_allocated_capacity = *psVar27;
                local_988._M_dataplus._M_p = (pointer)*puVar23;
              }
              local_988._M_string_length = puVar23[1];
              *puVar23 = psVar27;
              puVar23[1] = 0;
              *(undefined1 *)psVar27 = 0;
              plVar22 = (long *)std::__cxx11::string::append((char *)&local_988);
              psVar27 = (size_type *)(plVar22 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar22 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar27) {
                local_a28.field_2._M_allocated_capacity = *psVar27;
                local_a28.field_2._8_8_ = plVar22[3];
                local_a28._M_dataplus._M_p = (pointer)paVar25;
              }
              else {
                local_a28.field_2._M_allocated_capacity = *psVar27;
                local_a28._M_dataplus._M_p = (pointer)*plVar22;
              }
              local_a28._M_string_length = plVar22[1];
              *plVar22 = (long)psVar27;
              plVar22[1] = 0;
              *(undefined1 *)(plVar22 + 2) = 0;
              std::__cxx11::string::_M_append((char *)&local_480,(ulong)local_a28._M_dataplus._M_p);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_a28._M_dataplus._M_p != paVar25) {
                operator_delete(local_a28._M_dataplus._M_p,
                                local_a28.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_988._M_dataplus._M_p != &local_988.field_2) {
                operator_delete(local_988._M_dataplus._M_p,
                                local_988.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_638._M_dataplus._M_p != &local_638.field_2) {
                operator_delete(local_638._M_dataplus._M_p,
                                local_638.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_408._M_dataplus._M_p != &local_408.field_2) {
                operator_delete(local_408._M_dataplus._M_p,
                                local_408.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_928._M_allocated_capacity != &local_918) {
                operator_delete((void *)local_928._M_allocated_capacity,
                                local_918._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_4a0._M_dataplus._M_p != &local_4a0.field_2) {
                operator_delete(local_4a0._M_dataplus._M_p,
                                local_4a0.field_2._M_allocated_capacity + 1);
              }
            }
            p_Var24 = (_Base_ptr)std::_Rb_tree_increment(p_Var24);
          } while ((_Rb_tree_header *)p_Var24 != p_Var1);
        }
        p_Var24 = (local_a08->super_cmCPackGenerator).Components._M_t._M_impl.super__Rb_tree_header.
                  _M_header._M_left;
        local_640 = &(local_a08->super_cmCPackGenerator).Components._M_t._M_impl.
                     super__Rb_tree_header._M_header;
        if (p_Var24 == local_640) {
          bVar35 = 0;
        }
        else {
          paVar25 = &local_a28.field_2;
          bVar35 = 0;
          do {
            if (p_Var24[9]._M_right != *(_Base_ptr *)(p_Var24 + 10)) {
              bVar6 = bVar35 & 1;
              bVar35 = *(byte *)&p_Var24[4]._M_parent >> 3;
              if (bVar6 != 0) {
                bVar35 = 1;
              }
              if (*(long *)(p_Var24 + 4) == 0) {
                CreateComponentDescription_abi_cxx11_
                          (&local_a28,local_a08,(cmCPackComponent *)(p_Var24 + 2),
                           (ostream *)local_8c8);
                std::__cxx11::string::_M_append(local_618,(ulong)local_a28._M_dataplus._M_p);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_a28._M_dataplus._M_p != paVar25) {
                  operator_delete(local_a28._M_dataplus._M_p,
                                  local_a28.field_2._M_allocated_capacity + 1);
                }
              }
              std::__cxx11::string::append((char *)&local_a00);
              std::__cxx11::string::_M_append((char *)&local_a00,*(ulong *)(p_Var24 + 1));
              std::__cxx11::string::append((char *)&local_a00);
              p_Var21 = p_Var24 + 1;
              std::operator+(&local_988,"Var ",
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             p_Var21);
              plVar22 = (long *)std::__cxx11::string::append((char *)&local_988);
              psVar27 = (size_type *)(plVar22 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar22 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar27) {
                local_a28.field_2._M_allocated_capacity = *psVar27;
                local_a28.field_2._8_8_ = plVar22[3];
                local_a28._M_dataplus._M_p = (pointer)paVar25;
              }
              else {
                local_a28.field_2._M_allocated_capacity = *psVar27;
                local_a28._M_dataplus._M_p = (pointer)*plVar22;
              }
              local_a28._M_string_length = plVar22[1];
              *plVar22 = (long)psVar27;
              plVar22[1] = 0;
              *(undefined1 *)(plVar22 + 2) = 0;
              std::__cxx11::string::_M_append
                        (local_8e8._M_local_buf,(ulong)local_a28._M_dataplus._M_p);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_a28._M_dataplus._M_p != paVar25) {
                operator_delete(local_a28._M_dataplus._M_p,
                                local_a28.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_988._M_dataplus._M_p != &local_988.field_2) {
                operator_delete(local_988._M_dataplus._M_p,
                                local_988.field_2._M_allocated_capacity + 1);
              }
              std::operator+(&local_988,"Var ",
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             p_Var21);
              plVar22 = (long *)std::__cxx11::string::append((char *)&local_988);
              psVar27 = (size_type *)(plVar22 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar22 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar27) {
                local_a28.field_2._M_allocated_capacity = *psVar27;
                local_a28.field_2._8_8_ = plVar22[3];
                local_a28._M_dataplus._M_p = (pointer)paVar25;
              }
              else {
                local_a28.field_2._M_allocated_capacity = *psVar27;
                local_a28._M_dataplus._M_p = (pointer)*plVar22;
              }
              local_a28._M_string_length = plVar22[1];
              *plVar22 = (long)psVar27;
              plVar22[1] = 0;
              *(undefined1 *)(plVar22 + 2) = 0;
              std::__cxx11::string::_M_append
                        (local_8e8._M_local_buf,(ulong)local_a28._M_dataplus._M_p);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_a28._M_dataplus._M_p != paVar25) {
                operator_delete(local_a28._M_dataplus._M_p,
                                local_a28.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_988._M_dataplus._M_p != &local_988.field_2) {
                operator_delete(local_988._M_dataplus._M_p,
                                local_988.field_2._M_allocated_capacity + 1);
              }
              if (p_Var24[4]._M_right != (_Base_ptr)0x0) {
                std::operator+(&local_4a0,"  !insertmacro MUI_DESCRIPTION_TEXT ${",
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               p_Var21);
                plVar22 = (long *)std::__cxx11::string::append((char *)&local_4a0);
                local_928._M_allocated_capacity = (size_type)&local_918;
                puVar26 = (ulong *)(plVar22 + 2);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*plVar22 ==
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)puVar26) {
                  local_918._M_allocated_capacity = *puVar26;
                  local_918._8_4_ = (undefined4)plVar22[3];
                  local_918._12_4_ = *(undefined4 *)((long)plVar22 + 0x1c);
                }
                else {
                  local_918._M_allocated_capacity = *puVar26;
                  local_928._M_allocated_capacity =
                       (size_type)
                       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)*plVar22;
                }
                local_928._8_8_ = plVar22[1];
                *plVar22 = (long)puVar26;
                plVar22[1] = 0;
                *(undefined1 *)(plVar22 + 2) = 0;
                local_428._M_dataplus._M_p = (pointer)&local_428.field_2;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_428,p_Var24[4]._M_left,
                           (long)&(p_Var24[4]._M_right)->_M_color + (long)p_Var24[4]._M_left);
                TranslateNewlines(&local_638,&local_428);
                uVar32 = 0xf;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_928._M_allocated_capacity != &local_918) {
                  uVar32 = local_918._M_allocated_capacity;
                }
                if ((ulong)uVar32 < local_638._M_string_length + local_928._8_8_) {
                  uVar32 = 0xf;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_638._M_dataplus._M_p != &local_638.field_2) {
                    uVar32 = local_638.field_2._M_allocated_capacity;
                  }
                  if ((ulong)uVar32 < local_638._M_string_length + local_928._8_8_)
                  goto LAB_001bc453;
                  puVar23 = (undefined8 *)
                            std::__cxx11::string::replace
                                      ((ulong)&local_638,0,(char *)0x0,
                                       local_928._M_allocated_capacity);
                }
                else {
LAB_001bc453:
                  puVar23 = (undefined8 *)
                            std::__cxx11::string::_M_append
                                      (local_928._M_local_buf,(ulong)local_638._M_dataplus._M_p);
                }
                local_988._M_dataplus._M_p = (pointer)&local_988.field_2;
                psVar27 = puVar23 + 2;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*puVar23 ==
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)psVar27) {
                  local_988.field_2._M_allocated_capacity = *psVar27;
                  local_988.field_2._8_8_ = puVar23[3];
                }
                else {
                  local_988.field_2._M_allocated_capacity = *psVar27;
                  local_988._M_dataplus._M_p = (pointer)*puVar23;
                }
                local_988._M_string_length = puVar23[1];
                *puVar23 = psVar27;
                puVar23[1] = 0;
                *(undefined1 *)psVar27 = 0;
                plVar22 = (long *)std::__cxx11::string::append((char *)&local_988);
                psVar27 = (size_type *)(plVar22 + 2);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*plVar22 ==
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)psVar27) {
                  local_a28.field_2._M_allocated_capacity = *psVar27;
                  local_a28.field_2._8_8_ = plVar22[3];
                  local_a28._M_dataplus._M_p = (pointer)paVar25;
                }
                else {
                  local_a28.field_2._M_allocated_capacity = *psVar27;
                  local_a28._M_dataplus._M_p = (pointer)*plVar22;
                }
                local_a28._M_string_length = plVar22[1];
                *plVar22 = (long)psVar27;
                plVar22[1] = 0;
                *(undefined1 *)(plVar22 + 2) = 0;
                std::__cxx11::string::_M_append
                          ((char *)&local_660,(ulong)local_a28._M_dataplus._M_p);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_a28._M_dataplus._M_p != paVar25) {
                  operator_delete(local_a28._M_dataplus._M_p,
                                  local_a28.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_988._M_dataplus._M_p != &local_988.field_2) {
                  operator_delete(local_988._M_dataplus._M_p,
                                  local_988.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_638._M_dataplus._M_p != &local_638.field_2) {
                  operator_delete(local_638._M_dataplus._M_p,
                                  local_638.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_428._M_dataplus._M_p != &local_428.field_2) {
                  operator_delete(local_428._M_dataplus._M_p,
                                  local_428.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_928._M_allocated_capacity != &local_918) {
                  operator_delete((void *)local_928._M_allocated_capacity,
                                  local_918._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_4a0._M_dataplus._M_p != &local_4a0.field_2) {
                  operator_delete(local_4a0._M_dataplus._M_p,
                                  local_4a0.field_2._M_allocated_capacity + 1);
                }
              }
            }
            p_Var24 = (_Base_ptr)std::_Rb_tree_increment(p_Var24);
          } while (p_Var24 != local_640);
        }
        std::__cxx11::stringbuf::str();
        std::__cxx11::string::_M_append(local_618,(ulong)local_a28._M_dataplus._M_p);
        paVar25 = &local_a28.field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a28._M_dataplus._M_p != paVar25) {
          operator_delete(local_a28._M_dataplus._M_p,local_a28.field_2._M_allocated_capacity + 1);
        }
        if (local_478 == 0 && local_660._M_string_length == 0) {
          local_a28._M_dataplus._M_p = (pointer)paVar25;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_a28,"CPACK_NSIS_INSTALLER_MUI_COMPONENTS_DESC","");
          cmCPackGenerator::SetOptionIfNotSet
                    (&local_a08->super_cmCPackGenerator,&local_a28,
                     "!define MUI_COMPONENTSPAGE_NODESC");
        }
        else {
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_928,"!insertmacro MUI_FUNCTION_DESCRIPTION_BEGIN\n",&local_660);
          puVar23 = (undefined8 *)
                    std::__cxx11::string::_M_append(local_928._M_local_buf,(ulong)local_480);
          psVar27 = puVar23 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar23 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar27) {
            local_988.field_2._M_allocated_capacity = *psVar27;
            local_988.field_2._8_8_ = puVar23[3];
            local_988._M_dataplus._M_p = (pointer)&local_988.field_2;
          }
          else {
            local_988.field_2._M_allocated_capacity = *psVar27;
            local_988._M_dataplus._M_p = (pointer)*puVar23;
          }
          local_988._M_string_length = puVar23[1];
          *puVar23 = psVar27;
          puVar23[1] = 0;
          *(undefined1 *)(puVar23 + 2) = 0;
          plVar22 = (long *)std::__cxx11::string::append((char *)&local_988);
          psVar27 = (size_type *)(plVar22 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar22 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar27) {
            local_a28.field_2._M_allocated_capacity = *psVar27;
            local_a28.field_2._8_8_ = plVar22[3];
            local_a28._M_dataplus._M_p = (pointer)paVar25;
          }
          else {
            local_a28.field_2._M_allocated_capacity = *psVar27;
            local_a28._M_dataplus._M_p = (pointer)*plVar22;
          }
          local_a28._M_string_length = plVar22[1];
          *plVar22 = (long)psVar27;
          plVar22[1] = 0;
          *(undefined1 *)(plVar22 + 2) = 0;
          std::__cxx11::string::operator=((string *)&local_660,(string *)&local_a28);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a28._M_dataplus._M_p != paVar25) {
            operator_delete(local_a28._M_dataplus._M_p,local_a28.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_988._M_dataplus._M_p != &local_988.field_2) {
            operator_delete(local_988._M_dataplus._M_p,local_988.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_928._M_allocated_capacity != &local_918) {
            operator_delete((void *)local_928._M_allocated_capacity,
                            local_918._M_allocated_capacity + 1);
          }
          local_a28._M_dataplus._M_p = (pointer)paVar25;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_a28,"CPACK_NSIS_INSTALLER_MUI_COMPONENTS_DESC","");
          cmCPackGenerator::SetOptionIfNotSet
                    (&local_a08->super_cmCPackGenerator,&local_a28,&local_660);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a28._M_dataplus._M_p != paVar25) {
          operator_delete(local_a28._M_dataplus._M_p,local_a28.field_2._M_allocated_capacity + 1);
        }
        pcVar36 = local_a08;
        if ((bVar35 & 1) != 0) {
          std::__cxx11::string::append((char *)&local_448);
          local_a28._M_dataplus._M_p = (pointer)paVar25;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_a28,"CPACK_ADD_REMOVE","");
          cVar20 = cmCPackGenerator::GetOption(&pcVar36->super_cmCPackGenerator,&local_a28);
          if (cVar20.Value == (string *)0x0) {
            bVar8 = false;
          }
          else {
            value._M_str = extraout_RDX;
            value._M_len = (size_t)((cVar20.Value)->_M_dataplus)._M_p;
            bVar8 = cmValue::IsOn((cmValue *)(cVar20.Value)->_M_string_length,value);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a28._M_dataplus._M_p != paVar25) {
            operator_delete(local_a28._M_dataplus._M_p,local_a28.field_2._M_allocated_capacity + 1);
          }
          if (bVar8 != false) {
            std::__cxx11::string::append((char *)&local_448);
          }
        }
        local_a28._M_dataplus._M_p = (pointer)paVar25;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_a28,"CPACK_NSIS_INSTALLATION_TYPES","");
        cmCPackGenerator::SetOptionIfNotSet
                  (&pcVar36->super_cmCPackGenerator,&local_a28,(string *)&local_3e8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a28._M_dataplus._M_p != paVar25) {
          operator_delete(local_a28._M_dataplus._M_p,local_a28.field_2._M_allocated_capacity + 1);
        }
        local_a28._M_dataplus._M_p = (pointer)paVar25;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_a28,"CPACK_NSIS_PAGE_COMPONENTS","");
        cmCPackGenerator::SetOptionIfNotSet
                  (&pcVar36->super_cmCPackGenerator,&local_a28,"!insertmacro MUI_PAGE_COMPONENTS");
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a28._M_dataplus._M_p != paVar25) {
          operator_delete(local_a28._M_dataplus._M_p,local_a28.field_2._M_allocated_capacity + 1);
        }
        local_a28._M_dataplus._M_p = (pointer)paVar25;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_a28,"CPACK_NSIS_FULL_INSTALL","");
        cmCPackGenerator::SetOptionIfNotSet(&pcVar36->super_cmCPackGenerator,&local_a28,"");
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a28._M_dataplus._M_p != paVar25) {
          operator_delete(local_a28._M_dataplus._M_p,local_a28.field_2._M_allocated_capacity + 1);
        }
        local_a28._M_dataplus._M_p = (pointer)paVar25;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_a28,"CPACK_NSIS_COMPONENT_SECTIONS","");
        cmCPackGenerator::SetOptionIfNotSet
                  (&pcVar36->super_cmCPackGenerator,&local_a28,(string *)local_618);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a28._M_dataplus._M_p != paVar25) {
          operator_delete(local_a28._M_dataplus._M_p,local_a28.field_2._M_allocated_capacity + 1);
        }
        local_a28._M_dataplus._M_p = (pointer)paVar25;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_a28,"CPACK_NSIS_COMPONENT_SECTION_LIST","");
        cmCPackGenerator::SetOptionIfNotSet(&pcVar36->super_cmCPackGenerator,&local_a28,&local_a00);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a28._M_dataplus._M_p != paVar25) {
          operator_delete(local_a28._M_dataplus._M_p,local_a28.field_2._M_allocated_capacity + 1);
        }
        local_a28._M_dataplus._M_p = (pointer)paVar25;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_a28,"CPACK_NSIS_SECTION_SELECTED_VARS","");
        cmCPackGenerator::SetOptionIfNotSet
                  (&pcVar36->super_cmCPackGenerator,&local_a28,(string *)&local_8e8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a28._M_dataplus._M_p != paVar25) {
          operator_delete(local_a28._M_dataplus._M_p,local_a28.field_2._M_allocated_capacity + 1);
        }
        local_a28._M_dataplus._M_p = (pointer)paVar25;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_a28,"CPACK_NSIS_DEFINES","");
        cmCPackGenerator::SetOption
                  (&pcVar36->super_cmCPackGenerator,&local_a28,(string *)&local_448);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a28._M_dataplus._M_p != paVar25) {
          operator_delete(local_a28._M_dataplus._M_p,local_a28.field_2._M_allocated_capacity + 1);
        }
        if (local_460.
            super__Vector_base<cmCPackInstallationType_*,_std::allocator<cmCPackInstallationType_*>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_460.
                          super__Vector_base<cmCPackInstallationType_*,_std::allocator<cmCPackInstallationType_*>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_460.
                                super__Vector_base<cmCPackInstallationType_*,_std::allocator<cmCPackInstallationType_*>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_460.
                                super__Vector_base<cmCPackInstallationType_*,_std::allocator<cmCPackInstallationType_*>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_8c8);
        std::ios_base::~ios_base((ios_base *)&local_858);
        if (local_448 != &local_438) {
          operator_delete(local_448,CONCAT71(uStack_437,local_438) + 1);
        }
        if (local_3e8 != &local_3d8) {
          operator_delete(local_3e8,CONCAT71(uStack_3d7,local_3d8) + 1);
        }
        if (local_480 != &local_470) {
          operator_delete(local_480,CONCAT71(uStack_46f,local_470) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_660._M_dataplus._M_p != &local_660.field_2) {
          operator_delete(local_660._M_dataplus._M_p,
                          CONCAT71(local_660.field_2._M_allocated_capacity._1_7_,
                                   local_660.field_2._M_local_buf[0]) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_8e8._M_allocated_capacity != &local_8d8) {
          operator_delete((void *)local_8e8._M_allocated_capacity,
                          CONCAT71(local_8d8._M_allocated_capacity._1_7_,local_8d8._M_local_buf[0])
                          + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a00._M_dataplus._M_p != &local_a00.field_2) {
          operator_delete(local_a00._M_dataplus._M_p,local_a00.field_2._M_allocated_capacity + 1);
        }
        uVar32 = local_608._0_8_;
        auVar33 = (undefined1  [8])local_618._0_8_;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_618._0_8_ !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_608) {
LAB_001bcea1:
          operator_delete((void *)auVar33,(ulong)(uVar32 + 1));
        }
      }
      (*(pcVar36->super_cmCPackGenerator)._vptr_cmCPackGenerator[0xc])
                (pcVar36,&local_388,&local_9a8);
      (*(pcVar36->super_cmCPackGenerator)._vptr_cmCPackGenerator[0xc])
                (pcVar36,&local_3a8,&local_9c8);
      paVar25 = &local_660.field_2;
      local_660._M_dataplus._M_p = (pointer)paVar25;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_660,"CPACK_INSTALLER_PROGRAM","");
      psVar11 = (string *)cmCPackGenerator::GetOption(&pcVar36->super_cmCPackGenerator,&local_660);
      local_8c0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(local_608 + 8);
      local_618._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0x0;
      local_618._8_8_ = 1;
      local_608[8] = '\"';
      local_8c8 = (undefined1  [8])0x1;
      local_8b8._M_allocated_capacity = 0;
      if (psVar11 == (string *)0x0) {
        psVar11 = &cmValue::Empty_abi_cxx11_;
      }
      local_8a8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(psVar11->_M_dataplus)._M_p;
      local_8b8._8_8_ = psVar11->_M_string_length;
      local_8a0 = 0;
      local_898._M_allocated_capacity = 2;
      local_898._8_8_ = "\" ";
      local_888 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      local_880 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_948._M_string_length;
      local_878._M_dataplus._M_p = local_948._M_dataplus._M_p;
      local_878._M_string_length = 0;
      local_878.field_2._M_allocated_capacity = 2;
      local_878.field_2._8_8_ = " \"";
      local_858 = 0;
      local_850 = local_9c0;
      local_848 = local_9c8;
      local_840 = 0;
      local_a00.field_2._M_allocated_capacity = (long)&local_a00.field_2 + 8;
      local_a00._M_dataplus._M_p = (pointer)0x0;
      local_a00._M_string_length = 1;
      local_a00.field_2._M_local_buf[8] = '\"';
      local_838 = 1;
      local_828 = 0;
      views_14._M_len = 7;
      views_14._M_array = (iterator)local_8c8;
      local_830 = (undefined1 *)local_a00.field_2._M_allocated_capacity;
      local_608._0_8_ = local_8c0;
      cmCatViews((string *)&local_8e8,views_14);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_660._M_dataplus._M_p != paVar25) {
        operator_delete(local_660._M_dataplus._M_p,
                        CONCAT71(local_660.field_2._M_allocated_capacity._1_7_,
                                 local_660.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_908._M_string_length !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        local_8c8 = (undefined1  [8])local_8e8._8_8_;
        local_8c0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_8e8._M_allocated_capacity;
        local_8b8._M_allocated_capacity = 0;
        local_8b8._8_8_ = 1;
        local_8a8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)0x845575;
        local_8a0 = 0;
        local_898._M_allocated_capacity = local_908._M_string_length;
        local_898._8_8_ = local_908._M_dataplus._M_p;
        local_888 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        views_15._M_len = 3;
        views_15._M_array = (iterator)local_8c8;
        cmCatViews((string *)local_618,views_15);
        std::__cxx11::string::operator=((string *)local_8e8._M_local_buf,(string *)local_618);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_618._0_8_ !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_608) {
          operator_delete((void *)local_618._0_8_,(ulong)(local_608._0_8_ + 1));
        }
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_8c8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_8c8,"Execute: ",9);
      poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_8c8,(char *)local_8e8._M_allocated_capacity,
                           local_8e8._8_8_);
      std::ios::widen((char)poVar13->_vptr_basic_ostream[-3] + (char)poVar13);
      std::ostream::put((char)poVar13);
      std::ostream::flush();
      pcVar4 = (pcVar36->super_cmCPackGenerator).Logger;
      std::__cxx11::stringbuf::str();
      uVar32 = local_618._0_8_;
      sVar14 = strlen((char *)local_618._0_8_);
      cmCPackLog::Log(pcVar4,2,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CPack/cmCPackNSISGenerator.cxx"
                      ,0x188,(char *)uVar32,sVar14);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_618._0_8_ !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_608) {
        operator_delete((void *)local_618._0_8_,(ulong)(local_608._0_8_ + 1));
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_8c8);
      std::ios_base::~ios_base((ios_base *)&local_858);
      local_a00._M_string_length = 0;
      local_a00.field_2._M_allocated_capacity =
           local_a00.field_2._M_allocated_capacity & 0xffffffffffffff00;
      local_480 = (undefined1 *)CONCAT44(local_480._4_4_,1);
      local_a00._M_dataplus._M_p = (pointer)&local_a00.field_2;
      bVar8 = cmSystemTools::RunSingleCommand
                        ((string *)&local_8e8,&local_a00,&local_a00,(int *)&local_480,(char *)0x0,
                         (pcVar36->super_cmCPackGenerator).GeneratorVerbose,(cmDuration)0x0);
      iVar10 = 1;
      if (!bVar8 || (int)local_480 != 0) {
        cmGeneratedFileStream::cmGeneratedFileStream
                  ((cmGeneratedFileStream *)local_8c8,&local_3c8,false,None);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_8c8,"# Run command: ",0xf);
        poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_8c8,(char *)local_8e8._M_allocated_capacity,
                             local_8e8._8_8_);
        std::ios::widen((char)poVar13->_vptr_basic_ostream[-3] + (char)poVar13);
        std::ostream::put((char)poVar13);
        poVar13 = (ostream *)std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>(poVar13,"# Output:",9);
        std::ios::widen((char)poVar13->_vptr_basic_ostream[-3] + (char)poVar13);
        std::ostream::put((char)poVar13);
        poVar13 = (ostream *)std::ostream::flush();
        poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                            (poVar13,local_a00._M_dataplus._M_p,local_a00._M_string_length);
        std::ios::widen((char)poVar13->_vptr_basic_ostream[-3] + (char)poVar13);
        std::ostream::put((char)poVar13);
        std::ostream::flush();
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_618);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_618,"Problem running NSIS command: ",0x1e);
        poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_618,(char *)local_8e8._M_allocated_capacity,
                             local_8e8._8_8_);
        std::ios::widen((char)poVar13->_vptr_basic_ostream[-3] + (char)poVar13);
        std::ostream::put((char)poVar13);
        poVar13 = (ostream *)std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>(poVar13,"Please check ",0xd);
        poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                            (poVar13,local_3c8._M_dataplus._M_p,local_3c8._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar13," for errors",0xb);
        std::ios::widen((char)poVar13->_vptr_basic_ostream[-3] + (char)poVar13);
        std::ostream::put((char)poVar13);
        std::ostream::flush();
        pcVar4 = (pcVar36->super_cmCPackGenerator).Logger;
        std::__cxx11::stringbuf::str();
        _Var30._M_p = local_660._M_dataplus._M_p;
        sVar14 = strlen(local_660._M_dataplus._M_p);
        cmCPackLog::Log(pcVar4,0x10,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CPack/cmCPackNSISGenerator.cxx"
                        ,0x197,_Var30._M_p,sVar14);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_660._M_dataplus._M_p != paVar25) {
          operator_delete(local_660._M_dataplus._M_p,
                          CONCAT71(local_660.field_2._M_allocated_capacity._1_7_,
                                   local_660.field_2._M_local_buf[0]) + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_618);
        std::ios_base::~ios_base(local_5a8);
        cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_8c8);
        iVar10 = 0;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a00._M_dataplus._M_p != &local_a00.field_2) {
        operator_delete(local_a00._M_dataplus._M_p,local_a00.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_8e8._M_allocated_capacity != &local_8d8) {
        operator_delete((void *)local_8e8._M_allocated_capacity,
                        CONCAT71(local_8d8._M_allocated_capacity._1_7_,local_8d8._M_local_buf[0]) +
                        1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_908._M_dataplus._M_p != &local_908.field_2) {
        operator_delete(local_908._M_dataplus._M_p,
                        CONCAT71(local_908.field_2._M_allocated_capacity._1_7_,
                                 local_908.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_948._M_dataplus._M_p != &local_948.field_2) {
        operator_delete(local_948._M_dataplus._M_p,
                        CONCAT71(local_948.field_2._M_allocated_capacity._1_7_,
                                 local_948.field_2._M_local_buf[0]) + 1);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_968._M_dataplus._M_p != &local_968.field_2) {
      operator_delete(local_968._M_dataplus._M_p,
                      CONCAT71(local_968.field_2._M_allocated_capacity._1_7_,
                               local_968.field_2._M_local_buf[0]) + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_320);
    std::ios_base::~ios_base(local_2b0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_368);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
    if ((long *)local_9a8._M_allocated_capacity != local_998) {
      operator_delete((void *)local_9a8._M_allocated_capacity,local_998[0] + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3c8._M_dataplus._M_p != &local_3c8.field_2) {
      operator_delete(local_3c8._M_dataplus._M_p,local_3c8.field_2._M_allocated_capacity + 1);
    }
    if (local_9c8 != &local_9b8) {
      operator_delete(local_9c8,local_9b8._M_allocated_capacity + 1);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_388._M_dataplus._M_p != &local_388.field_2) {
    operator_delete(local_388._M_dataplus._M_p,local_388.field_2._M_allocated_capacity + 1);
  }
LAB_001bd61d:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3a8._M_dataplus._M_p != &local_3a8.field_2) {
    operator_delete(local_3a8._M_dataplus._M_p,local_3a8.field_2._M_allocated_capacity + 1);
  }
  return iVar10;
}

Assistant:

int cmCPackNSISGenerator::PackageFiles()
{
  // TODO: Fix nsis to force out file name

  std::string nsisInFileName = this->FindTemplate("NSIS.template.in");
  if (nsisInFileName.empty()) {
    cmCPackLogger(cmCPackLog::LOG_ERROR,
                  "CPack error: Could not find NSIS installer template file."
                    << std::endl);
    return false;
  }
  std::string nsisInInstallOptions =
    this->FindTemplate("NSIS.InstallOptions.ini.in");
  if (nsisInInstallOptions.empty()) {
    cmCPackLogger(cmCPackLog::LOG_ERROR,
                  "CPack error: Could not find NSIS installer options file."
                    << std::endl);
    return false;
  }

  std::string nsisFileName = this->GetOption("CPACK_TOPLEVEL_DIRECTORY");
  std::string tmpFile = cmStrCat(nsisFileName, "/NSISOutput.log");
  std::string nsisInstallOptions = nsisFileName + "/NSIS.InstallOptions.ini";
  nsisFileName += "/project.nsi";
  std::ostringstream str;
  for (std::string const& file : this->files) {
    std::string outputDir = "$INSTDIR";
    std::string fileN = cmSystemTools::RelativePath(this->toplevel, file);
    if (!this->Components.empty()) {
      const std::string::size_type pos = fileN.find('/');

      // Use the custom component install directory if we have one
      if (pos != std::string::npos) {
        auto componentName = cm::string_view(fileN).substr(0, pos);
        outputDir = this->CustomComponentInstallDirectory(componentName);
      } else {
        outputDir = this->CustomComponentInstallDirectory(fileN);
      }

      // Strip off the component part of the path.
      fileN = fileN.substr(pos + 1);
    }
    std::replace(fileN.begin(), fileN.end(), '/', '\\');

    str << "  Delete \"" << outputDir << "\\" << fileN << "\"" << std::endl;
  }
  cmCPackLogger(cmCPackLog::LOG_DEBUG,
                "Uninstall Files: " << str.str() << std::endl);
  this->SetOptionIfNotSet("CPACK_NSIS_DELETE_FILES", str.str());
  std::vector<std::string> dirs;
  this->GetListOfSubdirectories(this->toplevel.c_str(), dirs);
  std::ostringstream dstr;
  for (std::string const& dir : dirs) {
    std::string componentName;
    std::string fileN = cmSystemTools::RelativePath(this->toplevel, dir);
    if (fileN.empty()) {
      continue;
    }
    if (!this->Components.empty()) {
      // If this is a component installation, strip off the component
      // part of the path.
      std::string::size_type slash = fileN.find('/');
      if (slash != std::string::npos) {
        // If this is a component installation, determine which component it
        // is.
        componentName = fileN.substr(0, slash);

        // Strip off the component part of the path.
        fileN.erase(0, slash + 1);
      }
    }
    std::replace(fileN.begin(), fileN.end(), '/', '\\');

    const std::string componentOutputDir =
      this->CustomComponentInstallDirectory(componentName);

    dstr << "  RMDir \"" << componentOutputDir << "\\" << fileN << "\""
         << std::endl;
    if (!componentName.empty()) {
      this->Components[componentName].Directories.push_back(std::move(fileN));
    }
  }
  cmCPackLogger(cmCPackLog::LOG_DEBUG,
                "Uninstall Dirs: " << dstr.str() << std::endl);
  this->SetOptionIfNotSet("CPACK_NSIS_DELETE_DIRECTORIES", dstr.str());

  cmCPackLogger(cmCPackLog::LOG_VERBOSE,
                "Configure file: " << nsisInFileName << " to " << nsisFileName
                                   << std::endl);
  if (this->IsSet("CPACK_NSIS_MUI_ICON") ||
      this->IsSet("CPACK_NSIS_MUI_UNIICON")) {
    std::string installerIconCode;
    if (this->IsSet("CPACK_NSIS_MUI_ICON")) {
      installerIconCode += cmStrCat(
        "!define MUI_ICON \"", this->GetOption("CPACK_NSIS_MUI_ICON"), "\"\n");
    }
    if (this->IsSet("CPACK_NSIS_MUI_UNIICON")) {
      installerIconCode +=
        cmStrCat("!define MUI_UNICON \"",
                 this->GetOption("CPACK_NSIS_MUI_UNIICON"), "\"\n");
    }
    this->SetOptionIfNotSet("CPACK_NSIS_INSTALLER_MUI_ICON_CODE",
                            installerIconCode.c_str());
  }
  std::string installerHeaderImage;
  if (this->IsSet("CPACK_NSIS_MUI_HEADERIMAGE")) {
    installerHeaderImage = *this->GetOption("CPACK_NSIS_MUI_HEADERIMAGE");
  } else if (this->IsSet("CPACK_PACKAGE_ICON")) {
    installerHeaderImage = *this->GetOption("CPACK_PACKAGE_ICON");
  }
  if (!installerHeaderImage.empty()) {
    std::string installerIconCode = cmStrCat(
      "!define MUI_HEADERIMAGE_BITMAP \"", installerHeaderImage, "\"\n");
    this->SetOptionIfNotSet("CPACK_NSIS_INSTALLER_ICON_CODE",
                            installerIconCode);
  }

  if (this->IsSet("CPACK_NSIS_MUI_WELCOMEFINISHPAGE_BITMAP")) {
    std::string installerBitmapCode = cmStrCat(
      "!define MUI_WELCOMEFINISHPAGE_BITMAP \"",
      this->GetOption("CPACK_NSIS_MUI_WELCOMEFINISHPAGE_BITMAP"), "\"\n");
    this->SetOptionIfNotSet("CPACK_NSIS_INSTALLER_MUI_WELCOMEFINISH_CODE",
                            installerBitmapCode);
  }

  if (this->IsSet("CPACK_NSIS_MUI_UNWELCOMEFINISHPAGE_BITMAP")) {
    std::string installerBitmapCode = cmStrCat(
      "!define MUI_UNWELCOMEFINISHPAGE_BITMAP \"",
      this->GetOption("CPACK_NSIS_MUI_UNWELCOMEFINISHPAGE_BITMAP"), "\"\n");
    this->SetOptionIfNotSet("CPACK_NSIS_INSTALLER_MUI_UNWELCOMEFINISH_CODE",
                            installerBitmapCode);
  }

  if (this->IsSet("CPACK_NSIS_MUI_FINISHPAGE_RUN")) {
    std::string installerRunCode =
      cmStrCat("!define MUI_FINISHPAGE_RUN \"$INSTDIR\\",
               this->GetOption("CPACK_NSIS_EXECUTABLES_DIRECTORY"), '\\',
               this->GetOption("CPACK_NSIS_MUI_FINISHPAGE_RUN"), "\"\n");
    this->SetOptionIfNotSet("CPACK_NSIS_INSTALLER_MUI_FINISHPAGE_RUN_CODE",
                            installerRunCode);
  }

  if (this->IsSet("CPACK_NSIS_WELCOME_TITLE")) {
    std::string welcomeTitleCode =
      cmStrCat("!define MUI_WELCOMEPAGE_TITLE \"",
               this->GetOption("CPACK_NSIS_WELCOME_TITLE"), "\"");
    this->SetOptionIfNotSet("CPACK_NSIS_INSTALLER_WELCOME_TITLE_CODE",
                            welcomeTitleCode);
  }

  if (this->IsSet("CPACK_NSIS_WELCOME_TITLE_3LINES")) {
    this->SetOptionIfNotSet("CPACK_NSIS_INSTALLER_WELCOME_TITLE_3LINES_CODE",
                            "!define MUI_WELCOMEPAGE_TITLE_3LINES");
  }

  if (this->IsSet("CPACK_NSIS_FINISH_TITLE")) {
    std::string finishTitleCode =
      cmStrCat("!define MUI_FINISHPAGE_TITLE \"",
               this->GetOption("CPACK_NSIS_FINISH_TITLE"), "\"");
    this->SetOptionIfNotSet("CPACK_NSIS_INSTALLER_FINISH_TITLE_CODE",
                            finishTitleCode);
  }

  if (this->IsSet("CPACK_NSIS_FINISH_TITLE_3LINES")) {
    this->SetOptionIfNotSet("CPACK_NSIS_INSTALLER_FINISH_TITLE_3LINES_CODE",
                            "!define MUI_FINISHPAGE_TITLE_3LINES");
  }

  if (this->IsSet("CPACK_NSIS_MANIFEST_DPI_AWARE")) {
    this->SetOptionIfNotSet("CPACK_NSIS_MANIFEST_DPI_AWARE_CODE",
                            "ManifestDPIAware true");
  }

  if (this->IsSet("CPACK_NSIS_BRANDING_TEXT")) {
    // Default position to LEFT
    std::string brandingTextPosition = "LEFT";
    if (this->IsSet("CPACK_NSIS_BRANDING_TEXT_TRIM_POSITION")) {
      std::string wantedPosition =
        this->GetOption("CPACK_NSIS_BRANDING_TEXT_TRIM_POSITION");
      if (!wantedPosition.empty()) {
        const std::set<std::string> possiblePositions{ "CENTER", "LEFT",
                                                       "RIGHT" };
        if (possiblePositions.find(wantedPosition) ==
            possiblePositions.end()) {
          cmCPackLogger(cmCPackLog::LOG_ERROR,
                        "Unsupported branding text trim position "
                          << wantedPosition << std::endl);
          return false;
        }
        brandingTextPosition = wantedPosition;
      }
    }
    std::string brandingTextCode =
      cmStrCat("BrandingText /TRIM", brandingTextPosition, " \"",
               this->GetOption("CPACK_NSIS_BRANDING_TEXT"), "\"\n");
    this->SetOptionIfNotSet("CPACK_NSIS_BRANDING_TEXT_CODE", brandingTextCode);
  }

  if (!this->IsSet("CPACK_NSIS_IGNORE_LICENSE_PAGE")) {
    std::string licenceCode =
      cmStrCat("!insertmacro MUI_PAGE_LICENSE \"",
               this->GetOption("CPACK_RESOURCE_FILE_LICENSE"), "\"\n");
    this->SetOptionIfNotSet("CPACK_NSIS_LICENSE_PAGE", licenceCode);
  }

  std::string nsisPreArguments;
  if (cmValue nsisArguments =
        this->GetOption("CPACK_NSIS_EXECUTABLE_PRE_ARGUMENTS")) {
    cmList expandedArguments{ nsisArguments };

    for (auto& arg : expandedArguments) {
      if (!cmHasPrefix(arg, NSIS_OPT)) {
        nsisPreArguments = cmStrCat(nsisPreArguments, NSIS_OPT);
      }
      nsisPreArguments = cmStrCat(nsisPreArguments, arg, ' ');
    }
  }

  std::string nsisPostArguments;
  if (cmValue nsisArguments =
        this->GetOption("CPACK_NSIS_EXECUTABLE_POST_ARGUMENTS")) {
    cmList expandedArguments{ nsisArguments };
    for (auto& arg : expandedArguments) {
      if (!cmHasPrefix(arg, NSIS_OPT)) {
        nsisPostArguments = cmStrCat(nsisPostArguments, NSIS_OPT);
      }
      nsisPostArguments = cmStrCat(nsisPostArguments, arg, ' ');
    }
  }

  // Setup all of the component sections
  if (this->Components.empty()) {
    this->SetOptionIfNotSet("CPACK_NSIS_INSTALLATION_TYPES", "");
    this->SetOptionIfNotSet("CPACK_NSIS_INSTALLER_MUI_COMPONENTS_DESC", "");
    this->SetOptionIfNotSet("CPACK_NSIS_PAGE_COMPONENTS", "");
    this->SetOptionIfNotSet("CPACK_NSIS_FULL_INSTALL",
                            R"(File /r "${INST_DIR}\*.*")");
    this->SetOptionIfNotSet("CPACK_NSIS_COMPONENT_SECTIONS", "");
    this->SetOptionIfNotSet("CPACK_NSIS_COMPONENT_SECTION_LIST", "");
    this->SetOptionIfNotSet("CPACK_NSIS_SECTION_SELECTED_VARS", "");
  } else {
    std::string componentCode;
    std::string sectionList;
    std::string selectedVarsList;
    std::string componentDescriptions;
    std::string groupDescriptions;
    std::string installTypesCode;
    std::string defines;
    std::ostringstream macrosOut;
    bool anyDownloadedComponents = false;

    // Create installation types. The order is significant, so we first fill
    // in a vector based on the indices, and print them in that order.
    std::vector<cmCPackInstallationType*> installTypes(
      this->InstallationTypes.size());
    for (auto& installType : this->InstallationTypes) {
      installTypes[installType.second.Index - 1] = &installType.second;
    }
    for (cmCPackInstallationType* installType : installTypes) {
      installTypesCode += "InstType \"";
      installTypesCode += installType->DisplayName;
      installTypesCode += "\"\n";
    }

    // Create installation groups first
    for (auto& group : this->ComponentGroups) {
      if (group.second.ParentGroup == nullptr) {
        componentCode +=
          this->CreateComponentGroupDescription(&group.second, macrosOut);
      }

      // Add the group description, if any.
      if (!group.second.Description.empty()) {
        groupDescriptions += "  !insertmacro MUI_DESCRIPTION_TEXT ${" +
          group.first + "} \"" +
          cmCPackNSISGenerator::TranslateNewlines(group.second.Description) +
          "\"\n";
      }
    }

    // Create the remaining components, which aren't associated with groups.
    for (auto& comp : this->Components) {
      if (comp.second.Files.empty()) {
        // NSIS cannot cope with components that have no files.
        continue;
      }

      anyDownloadedComponents =
        anyDownloadedComponents || comp.second.IsDownloaded;

      if (!comp.second.Group) {
        componentCode +=
          this->CreateComponentDescription(&comp.second, macrosOut);
      }

      // Add this component to the various section lists.
      sectionList += R"(  !insertmacro "${MacroName}" ")";
      sectionList += comp.first;
      sectionList += "\"\n";
      selectedVarsList += "Var " + comp.first + "_selected\n";
      selectedVarsList += "Var " + comp.first + "_was_installed\n";

      // Add the component description, if any.
      if (!comp.second.Description.empty()) {
        componentDescriptions += "  !insertmacro MUI_DESCRIPTION_TEXT ${" +
          comp.first + "} \"" +
          cmCPackNSISGenerator::TranslateNewlines(comp.second.Description) +
          "\"\n";
      }
    }

    componentCode += macrosOut.str();

    if (componentDescriptions.empty() && groupDescriptions.empty()) {
      // Turn off the "Description" box
      this->SetOptionIfNotSet("CPACK_NSIS_INSTALLER_MUI_COMPONENTS_DESC",
                              "!define MUI_COMPONENTSPAGE_NODESC");
    } else {
      componentDescriptions = "!insertmacro MUI_FUNCTION_DESCRIPTION_BEGIN\n" +
        componentDescriptions + groupDescriptions +
        "!insertmacro MUI_FUNCTION_DESCRIPTION_END\n";
      this->SetOptionIfNotSet("CPACK_NSIS_INSTALLER_MUI_COMPONENTS_DESC",
                              componentDescriptions);
    }

    if (anyDownloadedComponents) {
      defines += "!define CPACK_USES_DOWNLOAD\n";
      if (this->GetOption("CPACK_ADD_REMOVE").IsOn()) {
        defines += "!define CPACK_NSIS_ADD_REMOVE\n";
      }
    }

    this->SetOptionIfNotSet("CPACK_NSIS_INSTALLATION_TYPES", installTypesCode);
    this->SetOptionIfNotSet("CPACK_NSIS_PAGE_COMPONENTS",
                            "!insertmacro MUI_PAGE_COMPONENTS");
    this->SetOptionIfNotSet("CPACK_NSIS_FULL_INSTALL", "");
    this->SetOptionIfNotSet("CPACK_NSIS_COMPONENT_SECTIONS", componentCode);
    this->SetOptionIfNotSet("CPACK_NSIS_COMPONENT_SECTION_LIST", sectionList);
    this->SetOptionIfNotSet("CPACK_NSIS_SECTION_SELECTED_VARS",
                            selectedVarsList);
    this->SetOption("CPACK_NSIS_DEFINES", defines);
  }

  this->ConfigureFile(nsisInInstallOptions, nsisInstallOptions);
  this->ConfigureFile(nsisInFileName, nsisFileName);
  std::string nsisCmd =
    cmStrCat('"', this->GetOption("CPACK_INSTALLER_PROGRAM"), "\" ",
             nsisPreArguments, " \"", nsisFileName, '"');
  if (!nsisPostArguments.empty()) {
    nsisCmd = cmStrCat(nsisCmd, " ", nsisPostArguments);
  }
  cmCPackLogger(cmCPackLog::LOG_VERBOSE, "Execute: " << nsisCmd << std::endl);
  std::string output;
  int retVal = 1;
  bool res = cmSystemTools::RunSingleCommand(
    nsisCmd, &output, &output, &retVal, nullptr, this->GeneratorVerbose,
    cmDuration::zero());
  if (!res || retVal) {
    cmGeneratedFileStream ofs(tmpFile);
    ofs << "# Run command: " << nsisCmd << std::endl
        << "# Output:" << std::endl
        << output << std::endl;
    cmCPackLogger(cmCPackLog::LOG_ERROR,
                  "Problem running NSIS command: " << nsisCmd << std::endl
                                                   << "Please check "
                                                   << tmpFile << " for errors"
                                                   << std::endl);
    return 0;
  }
  return 1;
}